

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ess_test.cc
# Opt level: O2

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  EssDescribeScheduledTasksRequestType *this;
  HttpTestListener *this_00;
  undefined8 extraout_RAX;
  allocator<char> local_959;
  string local_958;
  EssDeleteScalingConfigurationResponseType resp_5;
  string local_918 [32];
  string local_8f8 [32];
  string local_8d8;
  EssAttachInstancesResponseType resp;
  EssAttachInstancesRequestType req;
  _Alloc_hider local_550;
  size_type local_548;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_540;
  _Alloc_hider local_530;
  size_type local_528;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_520;
  _Alloc_hider local_510;
  size_type local_508;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_500;
  _Alloc_hider local_4f0;
  size_type local_4e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e0;
  _Alloc_hider local_4d0;
  size_type local_4c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c0;
  _Alloc_hider local_4b0;
  size_type local_4a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a0;
  _Alloc_hider local_490;
  size_type local_488;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_480;
  _Alloc_hider local_470;
  size_type local_468;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_460;
  _Alloc_hider local_450;
  size_type local_448;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_440;
  _Alloc_hider local_430;
  size_type local_428;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_420;
  _Alloc_hider local_410;
  size_type local_408;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_400;
  _Alloc_hider local_3f0;
  size_type local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e0;
  _Alloc_hider local_3d0;
  size_type local_3c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c0;
  _Alloc_hider local_3b0;
  size_type local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0;
  _Alloc_hider local_390;
  size_type local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_380;
  _Alloc_hider local_370;
  size_type local_368;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360;
  _Alloc_hider local_350;
  size_type local_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  _Alloc_hider local_330;
  size_type local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  _Alloc_hider local_310;
  size_type local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  _Alloc_hider local_2f0;
  size_type local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  _Alloc_hider local_2d0;
  size_type local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  _Alloc_hider local_2b0;
  size_type local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  _Alloc_hider local_290;
  size_type local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  _Alloc_hider local_270;
  size_type local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  _Alloc_hider local_250;
  size_type local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  _Alloc_hider local_230;
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  _Alloc_hider local_210;
  size_type local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  _Alloc_hider local_1f0;
  size_type local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  _Alloc_hider local_1d0;
  size_type local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  _Alloc_hider local_1b0;
  size_type local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  size_type local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  _Alloc_hider local_170;
  size_type local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  _Alloc_hider local_150;
  size_type local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  _Alloc_hider local_130;
  size_type local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  _Alloc_hider local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  _Alloc_hider local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  _Alloc_hider local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  _Alloc_hider local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  _Alloc_hider local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  paVar1 = &req.owner_id.field_2;
  req.owner_id._M_string_length = 0;
  req.owner_id.field_2._M_local_buf[0] = '\0';
  paVar2 = &req.resource_owner_account.field_2;
  req.resource_owner_account._M_string_length = 0;
  req.resource_owner_account.field_2._M_local_buf[0] = '\0';
  paVar3 = &req.resource_owner_id.field_2;
  req.resource_owner_id._M_string_length = 0;
  req.resource_owner_id.field_2._M_local_buf[0] = '\0';
  paVar4 = &req.scaling_group_id.field_2;
  req.scaling_group_id._M_string_length = 0;
  req.scaling_group_id.field_2._M_local_buf[0] = '\0';
  req.instance_id1._M_dataplus._M_p = (pointer)&req.instance_id1.field_2;
  req.instance_id1._M_string_length = 0;
  req.instance_id1.field_2._M_local_buf[0] = '\0';
  req.instance_id2._M_dataplus._M_p = (pointer)&req.instance_id2.field_2;
  req.instance_id2._M_string_length = 0;
  req.instance_id2.field_2._M_local_buf[0] = '\0';
  req.instance_id3._M_dataplus._M_p = (pointer)&req.instance_id3.field_2;
  req.instance_id3._M_string_length = 0;
  req.instance_id3.field_2._M_local_buf[0] = '\0';
  req.instance_id4._M_dataplus._M_p = (pointer)&req.instance_id4.field_2;
  req.instance_id4._M_string_length = 0;
  req.instance_id4.field_2._M_local_buf[0] = '\0';
  req.instance_id5._M_dataplus._M_p = (pointer)&req.instance_id5.field_2;
  req.instance_id5._M_string_length = 0;
  req.instance_id5.field_2._M_local_buf[0] = '\0';
  req.instance_id6._M_dataplus._M_p = (pointer)&req.instance_id6.field_2;
  req.instance_id6._M_string_length = 0;
  req.instance_id6.field_2._M_local_buf[0] = '\0';
  req.instance_id7._M_dataplus._M_p = (pointer)&req.instance_id7.field_2;
  req.instance_id7._M_string_length = 0;
  req.instance_id7.field_2._M_local_buf[0] = '\0';
  req.instance_id8._M_dataplus._M_p = (pointer)&req.instance_id8.field_2;
  req.instance_id8._M_string_length = 0;
  req.instance_id8.field_2._M_local_buf[0] = '\0';
  req.instance_id9._M_dataplus._M_p = (pointer)&req.instance_id9.field_2;
  req.instance_id9._M_string_length = 0;
  req.instance_id9.field_2._M_local_buf[0] = '\0';
  req.instance_id10._M_dataplus._M_p = (pointer)&req.instance_id10.field_2;
  req.instance_id10._M_string_length = 0;
  req.instance_id10.field_2._M_local_buf[0] = '\0';
  req.instance_id11._M_dataplus._M_p = (pointer)&req.instance_id11.field_2;
  req.instance_id11._M_string_length = 0;
  req.instance_id11.field_2._M_local_buf[0] = '\0';
  req.instance_id12._M_dataplus._M_p = (pointer)&req.instance_id12.field_2;
  req.instance_id12._M_string_length = 0;
  req.instance_id12.field_2._M_local_buf[0] = '\0';
  req.instance_id13._M_dataplus._M_p = (pointer)&req.instance_id13.field_2;
  req.instance_id13._M_string_length = 0;
  req.instance_id13.field_2._M_local_buf[0] = '\0';
  req.instance_id14._M_dataplus._M_p = (pointer)&req.instance_id14.field_2;
  req.instance_id14._M_string_length = 0;
  req.instance_id14.field_2._M_local_buf[0] = '\0';
  req.instance_id15._M_dataplus._M_p = (pointer)&req.instance_id15.field_2;
  req.instance_id15._M_string_length = 0;
  req.instance_id15.field_2._M_local_buf[0] = '\0';
  req.instance_id16._M_dataplus._M_p = (pointer)&req.instance_id16.field_2;
  req.instance_id16._M_string_length = 0;
  req.instance_id16.field_2._M_local_buf[0] = '\0';
  req.instance_id17._M_dataplus._M_p = (pointer)&req.instance_id17.field_2;
  req.instance_id17._M_string_length = 0;
  req.instance_id17.field_2._M_local_buf[0] = '\0';
  req.instance_id18._M_dataplus._M_p = (pointer)&req.instance_id18.field_2;
  req.instance_id18._M_string_length = 0;
  req.instance_id18.field_2._M_local_buf[0] = '\0';
  req.instance_id19._M_dataplus._M_p = (pointer)&req.instance_id19.field_2;
  req.instance_id19._M_string_length = 0;
  req.instance_id19.field_2._M_local_buf[0] = '\0';
  req.instance_id20._M_dataplus._M_p = (pointer)&req.instance_id20.field_2;
  req.instance_id20._M_string_length = 0;
  req.instance_id20.field_2._M_local_buf[0] = '\0';
  req.owner_account._M_dataplus._M_p = (pointer)&req.owner_account.field_2;
  req.owner_account._M_string_length = 0;
  req.owner_account.field_2._M_local_buf[0] = '\0';
  resp.scaling_activity_id._M_dataplus._M_p = (pointer)&resp.scaling_activity_id.field_2;
  resp.scaling_activity_id._M_string_length = 0;
  resp.scaling_activity_id.field_2._M_allocated_capacity =
       resp.scaling_activity_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
  req.owner_id._M_dataplus._M_p = (pointer)paVar1;
  req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
  req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
  req.scaling_group_id._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::string<std::allocator<char>>
            (local_8f8,"cn-hangzhou",(allocator<char> *)&local_958);
  std::__cxx11::string::string<std::allocator<char>>
            (local_918,"my_appid",(allocator<char> *)&resp_5);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8d8,"my_secret",&local_959);
  this = (EssDescribeScheduledTasksRequestType *)
         aliyun::Ess::CreateEssClient(local_8f8,local_918,&local_8d8);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::__cxx11::string::~string(local_918);
  std::__cxx11::string::~string(local_8f8);
  if (this == (EssDescribeScheduledTasksRequestType *)0x0) {
    std::__cxx11::string::~string((string *)&resp);
    aliyun::EssAttachInstancesRequestType::~EssAttachInstancesRequestType(&req);
    req.owner_id._M_string_length = 0;
    req.owner_id.field_2._M_local_buf[0] = '\0';
    req.resource_owner_account._M_string_length = 0;
    req.resource_owner_account.field_2._M_local_buf[0] = '\0';
    req.resource_owner_id._M_string_length = 0;
    req.resource_owner_id.field_2._M_local_buf[0] = '\0';
    req.scaling_group_id._M_string_length = 0;
    req.scaling_group_id.field_2._M_local_buf[0] = '\0';
    req.instance_id1._M_dataplus._M_p = (pointer)&req.instance_id1.field_2;
    req.instance_id1._M_string_length = 0;
    req.instance_id1.field_2._M_local_buf[0] = '\0';
    req.instance_id2._M_dataplus._M_p = (pointer)&req.instance_id2.field_2;
    req.instance_id2._M_string_length = 0;
    req.instance_id2.field_2._M_local_buf[0] = '\0';
    req.instance_id3._M_dataplus._M_p = (pointer)&req.instance_id3.field_2;
    req.instance_id3._M_string_length = 0;
    req.instance_id3.field_2._M_local_buf[0] = '\0';
    req.instance_id4._M_dataplus._M_p = (pointer)&req.instance_id4.field_2;
    req.instance_id4._M_string_length = 0;
    req.instance_id4.field_2._M_local_buf[0] = '\0';
    req.instance_id5._M_dataplus._M_p = (pointer)&req.instance_id5.field_2;
    req.instance_id5._M_string_length = 0;
    req.instance_id5.field_2._M_local_buf[0] = '\0';
    req.instance_id6._M_dataplus._M_p = (pointer)&req.instance_id6.field_2;
    req.instance_id6._M_string_length = 0;
    req.instance_id6.field_2._M_local_buf[0] = '\0';
    req.instance_id7._M_dataplus._M_p = (pointer)&req.instance_id7.field_2;
    req.instance_id7._M_string_length = 0;
    req.instance_id7.field_2._M_local_buf[0] = '\0';
    req.instance_id8._M_dataplus._M_p = (pointer)&req.instance_id8.field_2;
    req.instance_id8._M_string_length = 0;
    req.instance_id8.field_2._M_local_buf[0] = '\0';
    req.instance_id9._M_dataplus._M_p = (pointer)&req.instance_id9.field_2;
    req.instance_id9._M_string_length = 0;
    req.instance_id9.field_2._M_local_buf[0] = '\0';
    req.instance_id10._M_dataplus._M_p = (pointer)&req.instance_id10.field_2;
    req.instance_id10._M_string_length = 0;
    req.instance_id10.field_2._M_local_buf[0] = '\0';
    req.instance_id11._M_dataplus._M_p = (pointer)&req.instance_id11.field_2;
    req.instance_id11._M_string_length = 0;
    req.instance_id11.field_2._M_local_buf[0] = '\0';
    req.instance_id12._M_dataplus._M_p = (pointer)&req.instance_id12.field_2;
    req.instance_id12._M_string_length = 0;
    req.instance_id12.field_2._M_local_buf[0] = '\0';
    req.instance_id13._M_dataplus._M_p = (pointer)&req.instance_id13.field_2;
    req.instance_id13._M_string_length = 0;
    req.instance_id13.field_2._M_local_buf[0] = '\0';
    req.instance_id14._M_dataplus._M_p = (pointer)&req.instance_id14.field_2;
    req.instance_id14._M_string_length = 0;
    req.instance_id14.field_2._M_local_buf[0] = '\0';
    req.instance_id15._M_dataplus._M_p = (pointer)&req.instance_id15.field_2;
    req.instance_id15._M_string_length = 0;
    req.instance_id15.field_2._M_local_buf[0] = '\0';
    req.instance_id16._M_dataplus._M_p = (pointer)&req.instance_id16.field_2;
    req.instance_id16._M_string_length = 0;
    req.instance_id16.field_2._M_local_buf[0] = '\0';
    req.instance_id17._M_dataplus._M_p = (pointer)&req.instance_id17.field_2;
    req.instance_id17._M_string_length = 0;
    req.instance_id17.field_2._M_local_buf[0] = '\0';
    req.instance_id18._M_dataplus._M_p = (pointer)&req.instance_id18.field_2;
    req.instance_id18._M_string_length = 0;
    req.instance_id18.field_2._M_local_buf[0] = '\0';
    req.instance_id19._M_dataplus._M_p = (pointer)&req.instance_id19.field_2;
    req.instance_id19._M_string_length = 0;
    req.instance_id19.field_2._M_local_buf[0] = '\0';
    req.instance_id20._M_dataplus._M_p = (pointer)&req.instance_id20.field_2;
    req.instance_id20._M_string_length = 0;
    req.instance_id20.field_2._M_local_buf[0] = '\0';
    req.owner_account._M_dataplus._M_p = (pointer)&req.owner_account.field_2;
    req.owner_account._M_string_length = 0;
    req.owner_account.field_2._M_local_buf[0] = '\0';
    local_550._M_p = (pointer)&local_540;
    local_548 = 0;
    local_540._M_local_buf[0] = '\0';
    local_530._M_p = (pointer)&local_520;
    local_528 = 0;
    local_520._M_local_buf[0] = '\0';
    local_510._M_p = (pointer)&local_500;
    local_508 = 0;
    local_500._M_local_buf[0] = '\0';
    local_4f0._M_p = (pointer)&local_4e0;
    local_4e8 = 0;
    local_4e0._M_local_buf[0] = '\0';
    local_4d0._M_p = (pointer)&local_4c0;
    local_4c8 = 0;
    local_4c0._M_local_buf[0] = '\0';
    local_4b0._M_p = (pointer)&local_4a0;
    local_4a8 = 0;
    local_4a0._M_local_buf[0] = '\0';
    local_490._M_p = (pointer)&local_480;
    local_488 = 0;
    resp.scaling_activity_id._M_dataplus._M_p = (pointer)&resp.scaling_activity_id.field_2;
    resp.scaling_activity_id._M_string_length = 0;
    local_480._M_local_buf[0] = '\0';
    resp.scaling_activity_id.field_2._M_allocated_capacity =
         resp.scaling_activity_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_470._M_p = (pointer)&local_460;
    local_468 = 0;
    local_460._M_local_buf[0] = '\0';
    req.owner_id._M_dataplus._M_p = (pointer)paVar1;
    req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
    req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
    req.scaling_group_id._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::string<std::allocator<char>>
              (local_8f8,"cn-hangzhou",(allocator<char> *)&local_958);
    std::__cxx11::string::string<std::allocator<char>>
              (local_918,"my_appid",(allocator<char> *)&resp_5);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_8d8,"my_secret",&local_959);
    this = (EssDescribeScheduledTasksRequestType *)
           aliyun::Ess::CreateEssClient(local_8f8,local_918,&local_8d8);
    std::__cxx11::string::~string((string *)&local_8d8);
    std::__cxx11::string::~string(local_918);
    std::__cxx11::string::~string(local_8f8);
    if (this == (EssDescribeScheduledTasksRequestType *)0x0) {
      std::__cxx11::string::~string((string *)&resp);
      aliyun::EssCreateScalingConfigurationRequestType::~EssCreateScalingConfigurationRequestType
                ((EssCreateScalingConfigurationRequestType *)&req);
      req.owner_id._M_string_length = 0;
      req.owner_id.field_2._M_local_buf[0] = '\0';
      req.resource_owner_account._M_string_length = 0;
      req.resource_owner_account.field_2._M_local_buf[0] = '\0';
      req.resource_owner_id._M_string_length = 0;
      req.resource_owner_id.field_2._M_local_buf[0] = '\0';
      req.scaling_group_id._M_string_length = 0;
      req.scaling_group_id.field_2._M_local_buf[0] = '\0';
      req.instance_id1._M_dataplus._M_p = (pointer)&req.instance_id1.field_2;
      req.instance_id1._M_string_length = 0;
      req.instance_id1.field_2._M_local_buf[0] = '\0';
      req.instance_id2._M_dataplus._M_p = (pointer)&req.instance_id2.field_2;
      req.instance_id2._M_string_length = 0;
      req.instance_id2.field_2._M_local_buf[0] = '\0';
      req.instance_id3._M_dataplus._M_p = (pointer)&req.instance_id3.field_2;
      req.instance_id3._M_string_length = 0;
      req.instance_id3.field_2._M_local_buf[0] = '\0';
      req.instance_id4._M_dataplus._M_p = (pointer)&req.instance_id4.field_2;
      req.instance_id4._M_string_length = 0;
      req.instance_id4.field_2._M_local_buf[0] = '\0';
      req.instance_id5._M_dataplus._M_p = (pointer)&req.instance_id5.field_2;
      req.instance_id5._M_string_length = 0;
      req.instance_id5.field_2._M_local_buf[0] = '\0';
      req.instance_id6._M_dataplus._M_p = (pointer)&req.instance_id6.field_2;
      req.instance_id6._M_string_length = 0;
      req.instance_id6.field_2._M_local_buf[0] = '\0';
      req.instance_id7._M_dataplus._M_p = (pointer)&req.instance_id7.field_2;
      req.instance_id7._M_string_length = 0;
      req.instance_id7.field_2._M_local_buf[0] = '\0';
      req.instance_id8._M_dataplus._M_p = (pointer)&req.instance_id8.field_2;
      req.instance_id8._M_string_length = 0;
      req.instance_id8.field_2._M_local_buf[0] = '\0';
      req.instance_id9._M_dataplus._M_p = (pointer)&req.instance_id9.field_2;
      req.instance_id9._M_string_length = 0;
      req.instance_id9.field_2._M_local_buf[0] = '\0';
      req.instance_id10._M_dataplus._M_p = (pointer)&req.instance_id10.field_2;
      req.instance_id10._M_string_length = 0;
      req.instance_id10.field_2._M_local_buf[0] = '\0';
      resp.scaling_activity_id._M_dataplus._M_p = (pointer)&resp.scaling_activity_id.field_2;
      resp.scaling_activity_id._M_string_length = 0;
      resp.scaling_activity_id.field_2._M_allocated_capacity =
           resp.scaling_activity_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
      req.owner_id._M_dataplus._M_p = (pointer)paVar1;
      req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
      req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
      req.scaling_group_id._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::string<std::allocator<char>>
                (local_8f8,"cn-hangzhou",(allocator<char> *)&local_958);
      std::__cxx11::string::string<std::allocator<char>>
                (local_918,"my_appid",(allocator<char> *)&resp_5);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_8d8,"my_secret",&local_959);
      this = (EssDescribeScheduledTasksRequestType *)
             aliyun::Ess::CreateEssClient(local_8f8,local_918,&local_8d8);
      std::__cxx11::string::~string((string *)&local_8d8);
      std::__cxx11::string::~string(local_918);
      std::__cxx11::string::~string(local_8f8);
      if (this == (EssDescribeScheduledTasksRequestType *)0x0) {
        std::__cxx11::string::~string((string *)&resp);
        aliyun::EssCreateScalingGroupRequestType::~EssCreateScalingGroupRequestType
                  ((EssCreateScalingGroupRequestType *)&req);
        req.owner_id._M_string_length = 0;
        req.owner_id.field_2._M_local_buf[0] = '\0';
        req.resource_owner_account._M_string_length = 0;
        req.resource_owner_account.field_2._M_local_buf[0] = '\0';
        req.resource_owner_id._M_string_length = 0;
        req.resource_owner_id.field_2._M_local_buf[0] = '\0';
        req.scaling_group_id._M_string_length = 0;
        req.scaling_group_id.field_2._M_local_buf[0] = '\0';
        req.instance_id1._M_dataplus._M_p = (pointer)&req.instance_id1.field_2;
        req.instance_id1._M_string_length = 0;
        req.instance_id1.field_2._M_local_buf[0] = '\0';
        req.instance_id2._M_dataplus._M_p = (pointer)&req.instance_id2.field_2;
        req.instance_id2._M_string_length = 0;
        req.instance_id2.field_2._M_local_buf[0] = '\0';
        req.instance_id3._M_dataplus._M_p = (pointer)&req.instance_id3.field_2;
        req.instance_id3._M_string_length = 0;
        req.instance_id3.field_2._M_local_buf[0] = '\0';
        req.instance_id4._M_dataplus._M_p = (pointer)&req.instance_id4.field_2;
        req.instance_id4._M_string_length = 0;
        req.instance_id4.field_2._M_local_buf[0] = '\0';
        req.instance_id5._M_dataplus._M_p = (pointer)&req.instance_id5.field_2;
        req.instance_id5._M_string_length = 0;
        resp.scaling_activity_id._M_dataplus._M_p = (pointer)&resp.scaling_activity_id.field_2;
        resp.scaling_activity_id._M_string_length = 0;
        req.instance_id5.field_2._M_local_buf[0] = '\0';
        resp.scaling_activity_id.field_2._M_allocated_capacity =
             resp.scaling_activity_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
        req.owner_id._M_dataplus._M_p = (pointer)paVar1;
        req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
        req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
        req.scaling_group_id._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::string<std::allocator<char>>
                  (local_8f8,"cn-hangzhou",(allocator<char> *)&local_958);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_918,"my_appid",(allocator<char> *)&resp_5);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_8d8,"my_secret",&local_959);
        this = (EssDescribeScheduledTasksRequestType *)
               aliyun::Ess::CreateEssClient(local_8f8,local_918,&local_8d8);
        std::__cxx11::string::~string((string *)&local_8d8);
        std::__cxx11::string::~string(local_918);
        std::__cxx11::string::~string(local_8f8);
        if (this == (EssDescribeScheduledTasksRequestType *)0x0) {
          aliyun::EssCreateScalingRuleResponseType::~EssCreateScalingRuleResponseType
                    ((EssCreateScalingRuleResponseType *)&resp);
          aliyun::EssCreateScalingRuleRequestType::~EssCreateScalingRuleRequestType
                    ((EssCreateScalingRuleRequestType *)&req);
          req.owner_id._M_string_length = 0;
          req.owner_id.field_2._M_local_buf[0] = '\0';
          req.resource_owner_account._M_string_length = 0;
          req.resource_owner_account.field_2._M_local_buf[0] = '\0';
          req.resource_owner_id._M_string_length = 0;
          req.resource_owner_id.field_2._M_local_buf[0] = '\0';
          req.scaling_group_id._M_string_length = 0;
          req.scaling_group_id.field_2._M_local_buf[0] = '\0';
          req.instance_id1._M_dataplus._M_p = (pointer)&req.instance_id1.field_2;
          req.instance_id1._M_string_length = 0;
          req.instance_id1.field_2._M_local_buf[0] = '\0';
          req.instance_id2._M_dataplus._M_p = (pointer)&req.instance_id2.field_2;
          req.instance_id2._M_string_length = 0;
          req.instance_id2.field_2._M_local_buf[0] = '\0';
          req.instance_id3._M_dataplus._M_p = (pointer)&req.instance_id3.field_2;
          req.instance_id3._M_string_length = 0;
          req.instance_id3.field_2._M_local_buf[0] = '\0';
          req.instance_id4._M_dataplus._M_p = (pointer)&req.instance_id4.field_2;
          req.instance_id4._M_string_length = 0;
          req.instance_id4.field_2._M_local_buf[0] = '\0';
          req.instance_id5._M_dataplus._M_p = (pointer)&req.instance_id5.field_2;
          req.instance_id5._M_string_length = 0;
          req.instance_id5.field_2._M_local_buf[0] = '\0';
          req.instance_id6._M_dataplus._M_p = (pointer)&req.instance_id6.field_2;
          req.instance_id6._M_string_length = 0;
          req.instance_id6.field_2._M_local_buf[0] = '\0';
          req.instance_id7._M_dataplus._M_p = (pointer)&req.instance_id7.field_2;
          req.instance_id7._M_string_length = 0;
          req.instance_id7.field_2._M_local_buf[0] = '\0';
          req.instance_id8._M_dataplus._M_p = (pointer)&req.instance_id8.field_2;
          req.instance_id8._M_string_length = 0;
          req.instance_id8.field_2._M_local_buf[0] = '\0';
          req.instance_id9._M_dataplus._M_p = (pointer)&req.instance_id9.field_2;
          req.instance_id9._M_string_length = 0;
          req.instance_id9.field_2._M_local_buf[0] = '\0';
          resp.scaling_activity_id._M_dataplus._M_p = (pointer)&resp.scaling_activity_id.field_2;
          resp.scaling_activity_id._M_string_length = 0;
          resp.scaling_activity_id.field_2._M_allocated_capacity =
               resp.scaling_activity_id.field_2._M_allocated_capacity & 0xffffffffffffff00;
          req.owner_id._M_dataplus._M_p = (pointer)paVar1;
          req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
          req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
          req.scaling_group_id._M_dataplus._M_p = (pointer)paVar4;
          std::__cxx11::string::string<std::allocator<char>>
                    (local_8f8,"cn-hangzhou",(allocator<char> *)&local_958);
          std::__cxx11::string::string<std::allocator<char>>
                    (local_918,"my_appid",(allocator<char> *)&resp_5);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_8d8,"my_secret",&local_959);
          this = (EssDescribeScheduledTasksRequestType *)
                 aliyun::Ess::CreateEssClient(local_8f8,local_918,&local_8d8);
          std::__cxx11::string::~string((string *)&local_8d8);
          std::__cxx11::string::~string(local_918);
          std::__cxx11::string::~string(local_8f8);
          if (this == (EssDescribeScheduledTasksRequestType *)0x0) {
            std::__cxx11::string::~string((string *)&resp);
            aliyun::EssCreateScheduledTaskRequestType::~EssCreateScheduledTaskRequestType
                      ((EssCreateScheduledTaskRequestType *)&req);
            req.owner_id._M_string_length = 0;
            req.owner_id.field_2._M_local_buf[0] = '\0';
            req.resource_owner_account._M_string_length = 0;
            req.resource_owner_account.field_2._M_local_buf[0] = '\0';
            req.resource_owner_id._M_string_length = 0;
            req.resource_owner_id.field_2._M_local_buf[0] = '\0';
            req.scaling_group_id._M_string_length = 0;
            req.scaling_group_id.field_2._M_local_buf[0] = '\0';
            req.instance_id1._M_dataplus._M_p = (pointer)&req.instance_id1.field_2;
            req.instance_id1._M_string_length = 0;
            req.instance_id1.field_2._M_local_buf[0] = '\0';
            req.owner_id._M_dataplus._M_p = (pointer)paVar1;
            req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
            req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
            req.scaling_group_id._M_dataplus._M_p = (pointer)paVar4;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&resp,"cn-hangzhou",(allocator<char> *)&local_8d8);
            std::__cxx11::string::string<std::allocator<char>>
                      (local_8f8,"my_appid",(allocator<char> *)&local_958);
            std::__cxx11::string::string<std::allocator<char>>(local_918,"my_secret",&local_959);
            this = (EssDescribeScheduledTasksRequestType *)
                   aliyun::Ess::CreateEssClient(&resp,local_8f8,local_918);
            std::__cxx11::string::~string(local_918);
            std::__cxx11::string::~string(local_8f8);
            std::__cxx11::string::~string((string *)&resp);
            if (this == (EssDescribeScheduledTasksRequestType *)0x0) {
              aliyun::EssDeleteScalingConfigurationRequestType::
              ~EssDeleteScalingConfigurationRequestType
                        ((EssDeleteScalingConfigurationRequestType *)&req);
              req.owner_id._M_string_length = 0;
              req.owner_id.field_2._M_local_buf[0] = '\0';
              req.resource_owner_account._M_string_length = 0;
              req.resource_owner_account.field_2._M_local_buf[0] = '\0';
              req.resource_owner_id._M_string_length = 0;
              req.resource_owner_id.field_2._M_local_buf[0] = '\0';
              req.scaling_group_id._M_string_length = 0;
              req.scaling_group_id.field_2._M_local_buf[0] = '\0';
              req.instance_id1._M_dataplus._M_p = (pointer)&req.instance_id1.field_2;
              req.instance_id1._M_string_length = 0;
              req.instance_id1.field_2._M_local_buf[0] = '\0';
              req.instance_id2._M_dataplus._M_p = (pointer)&req.instance_id2.field_2;
              req.instance_id2._M_string_length = 0;
              req.instance_id2.field_2._M_local_buf[0] = '\0';
              req.owner_id._M_dataplus._M_p = (pointer)paVar1;
              req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
              req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
              req.scaling_group_id._M_dataplus._M_p = (pointer)paVar4;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&resp,"cn-hangzhou",(allocator<char> *)&local_8d8);
              std::__cxx11::string::string<std::allocator<char>>
                        (local_8f8,"my_appid",(allocator<char> *)&local_958);
              std::__cxx11::string::string<std::allocator<char>>(local_918,"my_secret",&local_959);
              this = (EssDescribeScheduledTasksRequestType *)
                     aliyun::Ess::CreateEssClient(&resp,local_8f8,local_918);
              std::__cxx11::string::~string(local_918);
              std::__cxx11::string::~string(local_8f8);
              std::__cxx11::string::~string((string *)&resp);
              if (this == (EssDescribeScheduledTasksRequestType *)0x0) {
                aliyun::EssDeleteScalingGroupRequestType::~EssDeleteScalingGroupRequestType
                          ((EssDeleteScalingGroupRequestType *)&req);
                req.owner_id._M_string_length = 0;
                req.owner_id.field_2._M_local_buf[0] = '\0';
                req.resource_owner_account._M_string_length = 0;
                req.resource_owner_account.field_2._M_local_buf[0] = '\0';
                req.resource_owner_id._M_string_length = 0;
                req.resource_owner_id.field_2._M_local_buf[0] = '\0';
                req.scaling_group_id._M_string_length = 0;
                req.scaling_group_id.field_2._M_local_buf[0] = '\0';
                req.instance_id1._M_dataplus._M_p = (pointer)&req.instance_id1.field_2;
                req.instance_id1._M_string_length = 0;
                req.instance_id1.field_2._M_local_buf[0] = '\0';
                req.owner_id._M_dataplus._M_p = (pointer)paVar1;
                req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
                req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
                req.scaling_group_id._M_dataplus._M_p = (pointer)paVar4;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&resp,"cn-hangzhou",(allocator<char> *)&local_8d8);
                std::__cxx11::string::string<std::allocator<char>>
                          (local_8f8,"my_appid",(allocator<char> *)&local_958);
                std::__cxx11::string::string<std::allocator<char>>(local_918,"my_secret",&local_959)
                ;
                this = (EssDescribeScheduledTasksRequestType *)
                       aliyun::Ess::CreateEssClient(&resp,local_8f8,local_918);
                std::__cxx11::string::~string(local_918);
                std::__cxx11::string::~string(local_8f8);
                std::__cxx11::string::~string((string *)&resp);
                if (this == (EssDescribeScheduledTasksRequestType *)0x0) {
                  aliyun::EssDeleteScalingRuleRequestType::~EssDeleteScalingRuleRequestType
                            ((EssDeleteScalingRuleRequestType *)&req);
                  req.owner_id._M_string_length = 0;
                  req.owner_id.field_2._M_local_buf[0] = '\0';
                  req.resource_owner_account._M_string_length = 0;
                  req.resource_owner_account.field_2._M_local_buf[0] = '\0';
                  req.resource_owner_id._M_string_length = 0;
                  req.resource_owner_id.field_2._M_local_buf[0] = '\0';
                  req.scaling_group_id._M_string_length = 0;
                  req.scaling_group_id.field_2._M_local_buf[0] = '\0';
                  req.instance_id1._M_dataplus._M_p = (pointer)&req.instance_id1.field_2;
                  req.instance_id1._M_string_length = 0;
                  req.instance_id1.field_2._M_local_buf[0] = '\0';
                  req.owner_id._M_dataplus._M_p = (pointer)paVar1;
                  req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
                  req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
                  req.scaling_group_id._M_dataplus._M_p = (pointer)paVar4;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&resp,"cn-hangzhou",(allocator<char> *)&local_8d8);
                  std::__cxx11::string::string<std::allocator<char>>
                            (local_8f8,"my_appid",(allocator<char> *)&local_958);
                  std::__cxx11::string::string<std::allocator<char>>
                            (local_918,"my_secret",&local_959);
                  this = (EssDescribeScheduledTasksRequestType *)
                         aliyun::Ess::CreateEssClient(&resp,local_8f8,local_918);
                  std::__cxx11::string::~string(local_918);
                  std::__cxx11::string::~string(local_8f8);
                  std::__cxx11::string::~string((string *)&resp);
                  if (this == (EssDescribeScheduledTasksRequestType *)0x0) {
                    aliyun::EssDeleteScheduledTaskRequestType::~EssDeleteScheduledTaskRequestType
                              ((EssDeleteScheduledTaskRequestType *)&req);
                    req.owner_id._M_string_length = 0;
                    req.owner_id.field_2._M_local_buf[0] = '\0';
                    req.resource_owner_account._M_string_length = 0;
                    req.resource_owner_account.field_2._M_local_buf[0] = '\0';
                    req.resource_owner_id._M_string_length = 0;
                    req.resource_owner_id.field_2._M_local_buf[0] = '\0';
                    req.scaling_group_id._M_string_length = 0;
                    req.scaling_group_id.field_2._M_local_buf[0] = '\0';
                    req.instance_id1._M_dataplus._M_p = (pointer)&req.instance_id1.field_2;
                    req.instance_id1._M_string_length = 0;
                    req.instance_id1.field_2._M_local_buf[0] = '\0';
                    req.instance_id2._M_dataplus._M_p = (pointer)&req.instance_id2.field_2;
                    req.instance_id2._M_string_length = 0;
                    req.instance_id2.field_2._M_local_buf[0] = '\0';
                    req.instance_id3._M_dataplus._M_p = (pointer)&req.instance_id3.field_2;
                    req.instance_id3._M_string_length = 0;
                    req.instance_id3.field_2._M_local_buf[0] = '\0';
                    req.instance_id4._M_dataplus._M_p = (pointer)&req.instance_id4.field_2;
                    req.instance_id4._M_string_length = 0;
                    req.instance_id4.field_2._M_local_buf[0] = '\0';
                    req.instance_id5._M_dataplus._M_p = (pointer)&req.instance_id5.field_2;
                    req.instance_id5._M_string_length = 0;
                    req.instance_id5.field_2._M_local_buf[0] = '\0';
                    req.instance_id6._M_dataplus._M_p = (pointer)&req.instance_id6.field_2;
                    req.instance_id6._M_string_length = 0;
                    req.instance_id6.field_2._M_local_buf[0] = '\0';
                    req.instance_id7._M_dataplus._M_p = (pointer)&req.instance_id7.field_2;
                    req.instance_id7._M_string_length = 0;
                    req.instance_id7.field_2._M_local_buf[0] = '\0';
                    req.instance_id8._M_dataplus._M_p = (pointer)&req.instance_id8.field_2;
                    req.instance_id8._M_string_length = 0;
                    req.instance_id8.field_2._M_local_buf[0] = '\0';
                    req.instance_id9._M_dataplus._M_p = (pointer)&req.instance_id9.field_2;
                    req.instance_id9._M_string_length = 0;
                    req.instance_id9.field_2._M_local_buf[0] = '\0';
                    req.instance_id10._M_dataplus._M_p = (pointer)&req.instance_id10.field_2;
                    req.instance_id10._M_string_length = 0;
                    req.instance_id10.field_2._M_local_buf[0] = '\0';
                    req.instance_id11._M_dataplus._M_p = (pointer)&req.instance_id11.field_2;
                    req.instance_id11._M_string_length = 0;
                    req.instance_id11.field_2._M_local_buf[0] = '\0';
                    req.instance_id12._M_dataplus._M_p = (pointer)&req.instance_id12.field_2;
                    req.instance_id12._M_string_length = 0;
                    req.instance_id12.field_2._M_local_buf[0] = '\0';
                    req.instance_id13._M_dataplus._M_p = (pointer)&req.instance_id13.field_2;
                    req.instance_id13._M_string_length = 0;
                    req.instance_id13.field_2._M_local_buf[0] = '\0';
                    req.instance_id14._M_dataplus._M_p = (pointer)&req.instance_id14.field_2;
                    req.instance_id14._M_string_length = 0;
                    req.instance_id14.field_2._M_local_buf[0] = '\0';
                    req.instance_id15._M_dataplus._M_p = (pointer)&req.instance_id15.field_2;
                    req.instance_id15._M_string_length = 0;
                    req.instance_id15.field_2._M_local_buf[0] = '\0';
                    req.instance_id16._M_dataplus._M_p = (pointer)&req.instance_id16.field_2;
                    req.instance_id16._M_string_length = 0;
                    req.instance_id16.field_2._M_local_buf[0] = '\0';
                    req.instance_id17._M_dataplus._M_p = (pointer)&req.instance_id17.field_2;
                    req.instance_id17._M_string_length = 0;
                    req.instance_id17.field_2._M_local_buf[0] = '\0';
                    req.instance_id18._M_dataplus._M_p = (pointer)&req.instance_id18.field_2;
                    req.instance_id18._M_string_length = 0;
                    req.instance_id18.field_2._M_local_buf[0] = '\0';
                    req.instance_id19._M_dataplus._M_p = (pointer)&req.instance_id19.field_2;
                    req.instance_id19._M_string_length = 0;
                    req.instance_id19.field_2._M_local_buf[0] = '\0';
                    req.instance_id20._M_dataplus._M_p = (pointer)&req.instance_id20.field_2;
                    req.instance_id20._M_string_length = 0;
                    req.instance_id20.field_2._M_local_buf[0] = '\0';
                    req.owner_account._M_dataplus._M_p = (pointer)&req.owner_account.field_2;
                    req.owner_account._M_string_length = 0;
                    req.owner_account.field_2._M_local_buf[0] = '\0';
                    local_550._M_p = (pointer)&local_540;
                    local_548 = 0;
                    local_540._M_local_buf[0] = '\0';
                    local_530._M_p = (pointer)&local_520;
                    local_528 = 0;
                    local_520._M_local_buf[0] = '\0';
                    local_510._M_p = (pointer)&local_500;
                    local_508 = 0;
                    local_500._M_local_buf[0] = '\0';
                    resp.scaling_activity_id._M_dataplus._M_p = (pointer)0x0;
                    resp.scaling_activity_id._M_string_length = 0;
                    resp.scaling_activity_id.field_2._M_allocated_capacity = 0;
                    req.owner_id._M_dataplus._M_p = (pointer)paVar1;
                    req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
                    req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
                    req.scaling_group_id._M_dataplus._M_p = (pointer)paVar4;
                    std::__cxx11::string::string<std::allocator<char>>
                              (local_8f8,"cn-hangzhou",(allocator<char> *)&local_958);
                    std::__cxx11::string::string<std::allocator<char>>
                              (local_918,"my_appid",(allocator<char> *)&resp_5);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_8d8,"my_secret",&local_959);
                    this = (EssDescribeScheduledTasksRequestType *)
                           aliyun::Ess::CreateEssClient(local_8f8,local_918,&local_8d8);
                    std::__cxx11::string::~string((string *)&local_8d8);
                    std::__cxx11::string::~string(local_918);
                    std::__cxx11::string::~string(local_8f8);
                    if (this == (EssDescribeScheduledTasksRequestType *)0x0) {
                      std::
                      vector<aliyun::EssDescribeScalingActivitiesScalingActivityType,_std::allocator<aliyun::EssDescribeScalingActivitiesScalingActivityType>_>
                      ::~vector((vector<aliyun::EssDescribeScalingActivitiesScalingActivityType,_std::allocator<aliyun::EssDescribeScalingActivitiesScalingActivityType>_>
                                 *)&resp);
                      aliyun::EssDescribeScalingActivitiesRequestType::
                      ~EssDescribeScalingActivitiesRequestType
                                ((EssDescribeScalingActivitiesRequestType *)&req);
                      req.owner_id._M_string_length = 0;
                      req.owner_id.field_2._M_local_buf[0] = '\0';
                      req.resource_owner_account._M_string_length = 0;
                      req.resource_owner_account.field_2._M_local_buf[0] = '\0';
                      req.resource_owner_id._M_string_length = 0;
                      req.resource_owner_id.field_2._M_local_buf[0] = '\0';
                      req.scaling_group_id._M_string_length = 0;
                      req.scaling_group_id.field_2._M_local_buf[0] = '\0';
                      req.instance_id1._M_dataplus._M_p = (pointer)&req.instance_id1.field_2;
                      req.instance_id1._M_string_length = 0;
                      req.instance_id1.field_2._M_local_buf[0] = '\0';
                      req.instance_id2._M_dataplus._M_p = (pointer)&req.instance_id2.field_2;
                      req.instance_id2._M_string_length = 0;
                      req.instance_id2.field_2._M_local_buf[0] = '\0';
                      req.instance_id3._M_dataplus._M_p = (pointer)&req.instance_id3.field_2;
                      req.instance_id3._M_string_length = 0;
                      req.instance_id3.field_2._M_local_buf[0] = '\0';
                      req.instance_id4._M_dataplus._M_p = (pointer)&req.instance_id4.field_2;
                      req.instance_id4._M_string_length = 0;
                      req.instance_id4.field_2._M_local_buf[0] = '\0';
                      req.instance_id5._M_dataplus._M_p = (pointer)&req.instance_id5.field_2;
                      req.instance_id5._M_string_length = 0;
                      req.instance_id5.field_2._M_local_buf[0] = '\0';
                      req.instance_id6._M_dataplus._M_p = (pointer)&req.instance_id6.field_2;
                      req.instance_id6._M_string_length = 0;
                      req.instance_id6.field_2._M_local_buf[0] = '\0';
                      req.instance_id7._M_dataplus._M_p = (pointer)&req.instance_id7.field_2;
                      req.instance_id7._M_string_length = 0;
                      req.instance_id7.field_2._M_local_buf[0] = '\0';
                      req.instance_id8._M_dataplus._M_p = (pointer)&req.instance_id8.field_2;
                      req.instance_id8._M_string_length = 0;
                      req.instance_id8.field_2._M_local_buf[0] = '\0';
                      req.instance_id9._M_dataplus._M_p = (pointer)&req.instance_id9.field_2;
                      req.instance_id9._M_string_length = 0;
                      req.instance_id9.field_2._M_local_buf[0] = '\0';
                      req.instance_id10._M_dataplus._M_p = (pointer)&req.instance_id10.field_2;
                      req.instance_id10._M_string_length = 0;
                      req.instance_id10.field_2._M_local_buf[0] = '\0';
                      req.instance_id11._M_dataplus._M_p = (pointer)&req.instance_id11.field_2;
                      req.instance_id11._M_string_length = 0;
                      req.instance_id11.field_2._M_local_buf[0] = '\0';
                      req.instance_id12._M_dataplus._M_p = (pointer)&req.instance_id12.field_2;
                      req.instance_id12._M_string_length = 0;
                      req.instance_id12.field_2._M_local_buf[0] = '\0';
                      req.instance_id13._M_dataplus._M_p = (pointer)&req.instance_id13.field_2;
                      req.instance_id13._M_string_length = 0;
                      req.instance_id13.field_2._M_local_buf[0] = '\0';
                      req.instance_id14._M_dataplus._M_p = (pointer)&req.instance_id14.field_2;
                      req.instance_id14._M_string_length = 0;
                      req.instance_id14.field_2._M_local_buf[0] = '\0';
                      req.instance_id15._M_dataplus._M_p = (pointer)&req.instance_id15.field_2;
                      req.instance_id15._M_string_length = 0;
                      req.instance_id15.field_2._M_local_buf[0] = '\0';
                      req.instance_id16._M_dataplus._M_p = (pointer)&req.instance_id16.field_2;
                      req.instance_id16._M_string_length = 0;
                      req.instance_id16.field_2._M_local_buf[0] = '\0';
                      req.instance_id17._M_dataplus._M_p = (pointer)&req.instance_id17.field_2;
                      req.instance_id17._M_string_length = 0;
                      req.instance_id17.field_2._M_local_buf[0] = '\0';
                      req.instance_id18._M_dataplus._M_p = (pointer)&req.instance_id18.field_2;
                      req.instance_id18._M_string_length = 0;
                      req.instance_id18.field_2._M_local_buf[0] = '\0';
                      req.instance_id19._M_dataplus._M_p = (pointer)&req.instance_id19.field_2;
                      req.instance_id19._M_string_length = 0;
                      req.instance_id19.field_2._M_local_buf[0] = '\0';
                      req.instance_id20._M_dataplus._M_p = (pointer)&req.instance_id20.field_2;
                      req.instance_id20._M_string_length = 0;
                      req.instance_id20.field_2._M_local_buf[0] = '\0';
                      req.owner_account._M_dataplus._M_p = (pointer)&req.owner_account.field_2;
                      req.owner_account._M_string_length = 0;
                      req.owner_account.field_2._M_local_buf[0] = '\0';
                      local_550._M_p = (pointer)&local_540;
                      local_548 = 0;
                      local_540._M_local_buf[0] = '\0';
                      local_530._M_p = (pointer)&local_520;
                      local_528 = 0;
                      local_520._M_local_buf[0] = '\0';
                      resp.scaling_activity_id._M_dataplus._M_p = (pointer)0x0;
                      resp.scaling_activity_id._M_string_length = 0;
                      resp.scaling_activity_id.field_2._M_allocated_capacity = 0;
                      req.owner_id._M_dataplus._M_p = (pointer)paVar1;
                      req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
                      req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
                      req.scaling_group_id._M_dataplus._M_p = (pointer)paVar4;
                      std::__cxx11::string::string<std::allocator<char>>
                                (local_8f8,"cn-hangzhou",(allocator<char> *)&local_958);
                      std::__cxx11::string::string<std::allocator<char>>
                                (local_918,"my_appid",(allocator<char> *)&resp_5);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_8d8,"my_secret",&local_959);
                      this = (EssDescribeScheduledTasksRequestType *)
                             aliyun::Ess::CreateEssClient(local_8f8,local_918,&local_8d8);
                      std::__cxx11::string::~string((string *)&local_8d8);
                      std::__cxx11::string::~string(local_918);
                      std::__cxx11::string::~string(local_8f8);
                      if (this == (EssDescribeScheduledTasksRequestType *)0x0) {
                        std::
                        vector<aliyun::EssDescribeScalingConfigurationsScalingConfigurationType,_std::allocator<aliyun::EssDescribeScalingConfigurationsScalingConfigurationType>_>
                        ::~vector((vector<aliyun::EssDescribeScalingConfigurationsScalingConfigurationType,_std::allocator<aliyun::EssDescribeScalingConfigurationsScalingConfigurationType>_>
                                   *)&resp);
                        aliyun::EssDescribeScalingConfigurationsRequestType::
                        ~EssDescribeScalingConfigurationsRequestType
                                  ((EssDescribeScalingConfigurationsRequestType *)&req);
                        req.owner_id._M_string_length = 0;
                        req.owner_id.field_2._M_local_buf[0] = '\0';
                        req.resource_owner_account._M_string_length = 0;
                        req.resource_owner_account.field_2._M_local_buf[0] = '\0';
                        req.resource_owner_id._M_string_length = 0;
                        req.resource_owner_id.field_2._M_local_buf[0] = '\0';
                        req.scaling_group_id._M_string_length = 0;
                        req.scaling_group_id.field_2._M_local_buf[0] = '\0';
                        req.instance_id1._M_dataplus._M_p = (pointer)&req.instance_id1.field_2;
                        req.instance_id1._M_string_length = 0;
                        req.instance_id1.field_2._M_local_buf[0] = '\0';
                        req.instance_id2._M_dataplus._M_p = (pointer)&req.instance_id2.field_2;
                        req.instance_id2._M_string_length = 0;
                        req.instance_id2.field_2._M_local_buf[0] = '\0';
                        req.instance_id3._M_dataplus._M_p = (pointer)&req.instance_id3.field_2;
                        req.instance_id3._M_string_length = 0;
                        req.instance_id3.field_2._M_local_buf[0] = '\0';
                        req.instance_id4._M_dataplus._M_p = (pointer)&req.instance_id4.field_2;
                        req.instance_id4._M_string_length = 0;
                        req.instance_id4.field_2._M_local_buf[0] = '\0';
                        req.instance_id5._M_dataplus._M_p = (pointer)&req.instance_id5.field_2;
                        req.instance_id5._M_string_length = 0;
                        req.instance_id5.field_2._M_local_buf[0] = '\0';
                        req.instance_id6._M_dataplus._M_p = (pointer)&req.instance_id6.field_2;
                        req.instance_id6._M_string_length = 0;
                        req.instance_id6.field_2._M_local_buf[0] = '\0';
                        req.instance_id7._M_dataplus._M_p = (pointer)&req.instance_id7.field_2;
                        req.instance_id7._M_string_length = 0;
                        req.instance_id7.field_2._M_local_buf[0] = '\0';
                        req.instance_id8._M_dataplus._M_p = (pointer)&req.instance_id8.field_2;
                        req.instance_id8._M_string_length = 0;
                        req.instance_id8.field_2._M_local_buf[0] = '\0';
                        req.instance_id9._M_dataplus._M_p = (pointer)&req.instance_id9.field_2;
                        req.instance_id9._M_string_length = 0;
                        req.instance_id9.field_2._M_local_buf[0] = '\0';
                        req.instance_id10._M_dataplus._M_p = (pointer)&req.instance_id10.field_2;
                        req.instance_id10._M_string_length = 0;
                        req.instance_id10.field_2._M_local_buf[0] = '\0';
                        req.instance_id11._M_dataplus._M_p = (pointer)&req.instance_id11.field_2;
                        req.instance_id11._M_string_length = 0;
                        req.instance_id11.field_2._M_local_buf[0] = '\0';
                        req.instance_id12._M_dataplus._M_p = (pointer)&req.instance_id12.field_2;
                        req.instance_id12._M_string_length = 0;
                        req.instance_id12.field_2._M_local_buf[0] = '\0';
                        req.instance_id13._M_dataplus._M_p = (pointer)&req.instance_id13.field_2;
                        req.instance_id13._M_string_length = 0;
                        req.instance_id13.field_2._M_local_buf[0] = '\0';
                        req.instance_id14._M_dataplus._M_p = (pointer)&req.instance_id14.field_2;
                        req.instance_id14._M_string_length = 0;
                        req.instance_id14.field_2._M_local_buf[0] = '\0';
                        req.instance_id15._M_dataplus._M_p = (pointer)&req.instance_id15.field_2;
                        req.instance_id15._M_string_length = 0;
                        req.instance_id15.field_2._M_local_buf[0] = '\0';
                        req.instance_id16._M_dataplus._M_p = (pointer)&req.instance_id16.field_2;
                        req.instance_id16._M_string_length = 0;
                        req.instance_id16.field_2._M_local_buf[0] = '\0';
                        req.instance_id17._M_dataplus._M_p = (pointer)&req.instance_id17.field_2;
                        req.instance_id17._M_string_length = 0;
                        req.instance_id17.field_2._M_local_buf[0] = '\0';
                        req.instance_id18._M_dataplus._M_p = (pointer)&req.instance_id18.field_2;
                        req.instance_id18._M_string_length = 0;
                        req.instance_id18.field_2._M_local_buf[0] = '\0';
                        req.instance_id19._M_dataplus._M_p = (pointer)&req.instance_id19.field_2;
                        req.instance_id19._M_string_length = 0;
                        req.instance_id19.field_2._M_local_buf[0] = '\0';
                        req.instance_id20._M_dataplus._M_p = (pointer)&req.instance_id20.field_2;
                        req.instance_id20._M_string_length = 0;
                        req.instance_id20.field_2._M_local_buf[0] = '\0';
                        req.owner_account._M_dataplus._M_p = (pointer)&req.owner_account.field_2;
                        req.owner_account._M_string_length = 0;
                        req.owner_account.field_2._M_local_buf[0] = '\0';
                        local_550._M_p = (pointer)&local_540;
                        local_548 = 0;
                        local_540._M_local_buf[0] = '\0';
                        local_530._M_p = (pointer)&local_520;
                        local_528 = 0;
                        local_520._M_local_buf[0] = '\0';
                        local_510._M_p = (pointer)&local_500;
                        local_508 = 0;
                        local_500._M_local_buf[0] = '\0';
                        local_4f0._M_p = (pointer)&local_4e0;
                        local_4e8 = 0;
                        local_4e0._M_local_buf[0] = '\0';
                        local_4d0._M_p = (pointer)&local_4c0;
                        local_4c8 = 0;
                        local_4c0._M_local_buf[0] = '\0';
                        local_4b0._M_p = (pointer)&local_4a0;
                        local_4a8 = 0;
                        local_4a0._M_local_buf[0] = '\0';
                        local_490._M_p = (pointer)&local_480;
                        local_488 = 0;
                        local_480._M_local_buf[0] = '\0';
                        local_470._M_p = (pointer)&local_460;
                        local_468 = 0;
                        local_460._M_local_buf[0] = '\0';
                        local_448 = 0;
                        local_440._M_local_buf[0] = '\0';
                        local_428 = 0;
                        local_420._M_local_buf[0] = '\0';
                        local_408 = 0;
                        local_400._M_local_buf[0] = '\0';
                        local_3e8 = 0;
                        local_3e0._M_local_buf[0] = '\0';
                        local_3d0._M_p = (pointer)&local_3c0;
                        local_3c8 = 0;
                        local_3c0._M_local_buf[0] = '\0';
                        local_3b0._M_p = (pointer)&local_3a0;
                        local_3a8 = 0;
                        local_3a0._M_local_buf[0] = '\0';
                        local_390._M_p = (pointer)&local_380;
                        local_388 = 0;
                        local_380._M_local_buf[0] = '\0';
                        local_370._M_p = (pointer)&local_360;
                        local_368 = 0;
                        local_360._M_local_buf[0] = '\0';
                        local_350._M_p = (pointer)&local_340;
                        local_348 = 0;
                        local_340._M_local_buf[0] = '\0';
                        local_330._M_p = (pointer)&local_320;
                        local_328 = 0;
                        local_320._M_local_buf[0] = '\0';
                        local_310._M_p = (pointer)&local_300;
                        local_308 = 0;
                        local_300._M_local_buf[0] = '\0';
                        local_2f0._M_p = (pointer)&local_2e0;
                        local_2e8 = 0;
                        local_2e0._M_local_buf[0] = '\0';
                        resp.scaling_activity_id._M_dataplus._M_p = (pointer)0x0;
                        resp.scaling_activity_id._M_string_length = 0;
                        resp.scaling_activity_id.field_2._M_allocated_capacity = 0;
                        req.owner_id._M_dataplus._M_p = (pointer)paVar1;
                        req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
                        req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
                        req.scaling_group_id._M_dataplus._M_p = (pointer)paVar4;
                        local_450._M_p = (pointer)&local_440;
                        local_430._M_p = (pointer)&local_420;
                        local_410._M_p = (pointer)&local_400;
                        local_3f0._M_p = (pointer)&local_3e0;
                        std::__cxx11::string::string<std::allocator<char>>
                                  (local_8f8,"cn-hangzhou",(allocator<char> *)&local_958);
                        std::__cxx11::string::string<std::allocator<char>>
                                  (local_918,"my_appid",(allocator<char> *)&resp_5);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_8d8,"my_secret",&local_959);
                        this = (EssDescribeScheduledTasksRequestType *)
                               aliyun::Ess::CreateEssClient(local_8f8,local_918,&local_8d8);
                        std::__cxx11::string::~string((string *)&local_8d8);
                        std::__cxx11::string::~string(local_918);
                        std::__cxx11::string::~string(local_8f8);
                        if (this == (EssDescribeScheduledTasksRequestType *)0x0) {
                          std::
                          vector<aliyun::EssDescribeScalingGroupsScalingGroupType,_std::allocator<aliyun::EssDescribeScalingGroupsScalingGroupType>_>
                          ::~vector((vector<aliyun::EssDescribeScalingGroupsScalingGroupType,_std::allocator<aliyun::EssDescribeScalingGroupsScalingGroupType>_>
                                     *)&resp);
                          aliyun::EssDescribeScalingGroupsRequestType::
                          ~EssDescribeScalingGroupsRequestType
                                    ((EssDescribeScalingGroupsRequestType *)&req);
                          req.owner_id._M_dataplus._M_p = (pointer)&req.owner_id.field_2;
                          req.owner_id._M_string_length = 0;
                          req.owner_id.field_2._M_local_buf[0] = '\0';
                          req.resource_owner_account._M_dataplus._M_p =
                               (pointer)&req.resource_owner_account.field_2;
                          req.resource_owner_account._M_string_length = 0;
                          req.resource_owner_account.field_2._M_local_buf[0] = '\0';
                          req.resource_owner_id._M_dataplus._M_p =
                               (pointer)&req.resource_owner_id.field_2;
                          req.resource_owner_id._M_string_length = 0;
                          req.resource_owner_id.field_2._M_local_buf[0] = '\0';
                          req.scaling_group_id._M_dataplus._M_p =
                               (pointer)&req.scaling_group_id.field_2;
                          req.scaling_group_id._M_string_length = 0;
                          req.scaling_group_id.field_2._M_local_buf[0] = '\0';
                          req.instance_id1._M_dataplus._M_p = (pointer)&req.instance_id1.field_2;
                          req.instance_id1._M_string_length = 0;
                          req.instance_id1.field_2._M_local_buf[0] = '\0';
                          req.instance_id2._M_dataplus._M_p = (pointer)&req.instance_id2.field_2;
                          req.instance_id2._M_string_length = 0;
                          req.instance_id2.field_2._M_local_buf[0] = '\0';
                          req.instance_id3._M_dataplus._M_p = (pointer)&req.instance_id3.field_2;
                          req.instance_id3._M_string_length = 0;
                          req.instance_id3.field_2._M_local_buf[0] = '\0';
                          req.instance_id4._M_dataplus._M_p = (pointer)&req.instance_id4.field_2;
                          req.instance_id4._M_string_length = 0;
                          req.instance_id4.field_2._M_local_buf[0] = '\0';
                          req.instance_id5._M_dataplus._M_p = (pointer)&req.instance_id5.field_2;
                          req.instance_id5._M_string_length = 0;
                          req.instance_id5.field_2._M_local_buf[0] = '\0';
                          req.instance_id6._M_dataplus._M_p = (pointer)&req.instance_id6.field_2;
                          req.instance_id6._M_string_length = 0;
                          req.instance_id6.field_2._M_local_buf[0] = '\0';
                          req.instance_id7._M_dataplus._M_p = (pointer)&req.instance_id7.field_2;
                          req.instance_id7._M_string_length = 0;
                          req.instance_id7.field_2._M_local_buf[0] = '\0';
                          req.instance_id8._M_dataplus._M_p = (pointer)&req.instance_id8.field_2;
                          req.instance_id8._M_string_length = 0;
                          req.instance_id8.field_2._M_local_buf[0] = '\0';
                          req.instance_id9._M_dataplus._M_p = (pointer)&req.instance_id9.field_2;
                          req.instance_id9._M_string_length = 0;
                          req.instance_id9.field_2._M_local_buf[0] = '\0';
                          req.instance_id10._M_dataplus._M_p = (pointer)&req.instance_id10.field_2;
                          req.instance_id10._M_string_length = 0;
                          req.instance_id10.field_2._M_local_buf[0] = '\0';
                          req.instance_id11._M_dataplus._M_p = (pointer)&req.instance_id11.field_2;
                          req.instance_id11._M_string_length = 0;
                          req.instance_id11.field_2._M_local_buf[0] = '\0';
                          req.instance_id12._M_dataplus._M_p = (pointer)&req.instance_id12.field_2;
                          req.instance_id12._M_string_length = 0;
                          req.instance_id12.field_2._M_local_buf[0] = '\0';
                          req.instance_id13._M_dataplus._M_p = (pointer)&req.instance_id13.field_2;
                          req.instance_id13._M_string_length = 0;
                          req.instance_id13.field_2._M_local_buf[0] = '\0';
                          req.instance_id14._M_dataplus._M_p = (pointer)&req.instance_id14.field_2;
                          req.instance_id14._M_string_length = 0;
                          req.instance_id14.field_2._M_local_buf[0] = '\0';
                          req.instance_id15._M_dataplus._M_p = (pointer)&req.instance_id15.field_2;
                          req.instance_id15._M_string_length = 0;
                          req.instance_id15.field_2._M_local_buf[0] = '\0';
                          req.instance_id16._M_dataplus._M_p = (pointer)&req.instance_id16.field_2;
                          req.instance_id16._M_string_length = 0;
                          req.instance_id16.field_2._M_local_buf[0] = '\0';
                          req.instance_id17._M_dataplus._M_p = (pointer)&req.instance_id17.field_2;
                          req.instance_id17._M_string_length = 0;
                          req.instance_id17.field_2._M_local_buf[0] = '\0';
                          req.instance_id18._M_dataplus._M_p = (pointer)&req.instance_id18.field_2;
                          req.instance_id18._M_string_length = 0;
                          req.instance_id18.field_2._M_local_buf[0] = '\0';
                          req.instance_id19._M_dataplus._M_p = (pointer)&req.instance_id19.field_2;
                          req.instance_id19._M_string_length = 0;
                          req.instance_id19.field_2._M_local_buf[0] = '\0';
                          req.instance_id20._M_dataplus._M_p = (pointer)&req.instance_id20.field_2;
                          req.instance_id20._M_string_length = 0;
                          req.instance_id20.field_2._M_local_buf[0] = '\0';
                          req.owner_account._M_dataplus._M_p = (pointer)&req.owner_account.field_2;
                          req.owner_account._M_string_length = 0;
                          req.owner_account.field_2._M_local_buf[0] = '\0';
                          local_550._M_p = (pointer)&local_540;
                          local_548 = 0;
                          local_540._M_local_buf[0] = '\0';
                          local_530._M_p = (pointer)&local_520;
                          local_528 = 0;
                          local_520._M_local_buf[0] = '\0';
                          local_510._M_p = (pointer)&local_500;
                          local_508 = 0;
                          local_500._M_local_buf[0] = '\0';
                          local_4f0._M_p = (pointer)&local_4e0;
                          local_4e8 = 0;
                          local_4e0._M_local_buf[0] = '\0';
                          local_4d0._M_p = (pointer)&local_4c0;
                          local_4c8 = 0;
                          local_4c0._M_local_buf[0] = '\0';
                          local_4b0._M_p = (pointer)&local_4a0;
                          local_4a8 = 0;
                          local_4a0._M_local_buf[0] = '\0';
                          resp.scaling_activity_id._M_dataplus._M_p = (pointer)0x0;
                          resp.scaling_activity_id._M_string_length = 0;
                          resp.scaling_activity_id.field_2._M_allocated_capacity = 0;
                          std::__cxx11::string::string<std::allocator<char>>
                                    (local_8f8,"cn-hangzhou",(allocator<char> *)&local_958);
                          std::__cxx11::string::string<std::allocator<char>>
                                    (local_918,"my_appid",(allocator<char> *)&resp_5);
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_8d8,"my_secret",&local_959);
                          this = (EssDescribeScheduledTasksRequestType *)
                                 aliyun::Ess::CreateEssClient(local_8f8,local_918,&local_8d8);
                          std::__cxx11::string::~string((string *)&local_8d8);
                          std::__cxx11::string::~string(local_918);
                          std::__cxx11::string::~string(local_8f8);
                          if (this == (EssDescribeScheduledTasksRequestType *)0x0) {
                            std::
                            vector<aliyun::EssDescribeScalingInstancesScalingInstanceType,_std::allocator<aliyun::EssDescribeScalingInstancesScalingInstanceType>_>
                            ::~vector((vector<aliyun::EssDescribeScalingInstancesScalingInstanceType,_std::allocator<aliyun::EssDescribeScalingInstancesScalingInstanceType>_>
                                       *)&resp);
                            aliyun::EssDescribeScalingInstancesRequestType::
                            ~EssDescribeScalingInstancesRequestType
                                      ((EssDescribeScalingInstancesRequestType *)&req);
                            req.owner_id._M_dataplus._M_p = (pointer)&req.owner_id.field_2;
                            req.owner_id._M_string_length = 0;
                            req.owner_id.field_2._M_local_buf[0] = '\0';
                            req.resource_owner_account._M_dataplus._M_p =
                                 (pointer)&req.resource_owner_account.field_2;
                            req.resource_owner_account._M_string_length = 0;
                            req.resource_owner_account.field_2._M_local_buf[0] = '\0';
                            req.resource_owner_id._M_dataplus._M_p =
                                 (pointer)&req.resource_owner_id.field_2;
                            req.resource_owner_id._M_string_length = 0;
                            req.resource_owner_id.field_2._M_local_buf[0] = '\0';
                            req.scaling_group_id._M_dataplus._M_p =
                                 (pointer)&req.scaling_group_id.field_2;
                            req.scaling_group_id._M_string_length = 0;
                            req.scaling_group_id.field_2._M_local_buf[0] = '\0';
                            req.instance_id1._M_dataplus._M_p = (pointer)&req.instance_id1.field_2;
                            req.instance_id1._M_string_length = 0;
                            req.instance_id1.field_2._M_local_buf[0] = '\0';
                            req.instance_id2._M_dataplus._M_p = (pointer)&req.instance_id2.field_2;
                            req.instance_id2._M_string_length = 0;
                            req.instance_id2.field_2._M_local_buf[0] = '\0';
                            req.instance_id3._M_dataplus._M_p = (pointer)&req.instance_id3.field_2;
                            req.instance_id3._M_string_length = 0;
                            req.instance_id3.field_2._M_local_buf[0] = '\0';
                            req.instance_id4._M_dataplus._M_p = (pointer)&req.instance_id4.field_2;
                            req.instance_id4._M_string_length = 0;
                            req.instance_id4.field_2._M_local_buf[0] = '\0';
                            req.instance_id5._M_dataplus._M_p = (pointer)&req.instance_id5.field_2;
                            req.instance_id5._M_string_length = 0;
                            req.instance_id5.field_2._M_local_buf[0] = '\0';
                            req.instance_id6._M_dataplus._M_p = (pointer)&req.instance_id6.field_2;
                            req.instance_id6._M_string_length = 0;
                            req.instance_id6.field_2._M_local_buf[0] = '\0';
                            req.instance_id7._M_dataplus._M_p = (pointer)&req.instance_id7.field_2;
                            req.instance_id7._M_string_length = 0;
                            req.instance_id7.field_2._M_local_buf[0] = '\0';
                            req.instance_id8._M_dataplus._M_p = (pointer)&req.instance_id8.field_2;
                            req.instance_id8._M_string_length = 0;
                            req.instance_id8.field_2._M_local_buf[0] = '\0';
                            req.instance_id9._M_dataplus._M_p = (pointer)&req.instance_id9.field_2;
                            req.instance_id9._M_string_length = 0;
                            req.instance_id9.field_2._M_local_buf[0] = '\0';
                            req.instance_id10._M_dataplus._M_p = (pointer)&req.instance_id10.field_2
                            ;
                            req.instance_id10._M_string_length = 0;
                            req.instance_id10.field_2._M_local_buf[0] = '\0';
                            req.instance_id11._M_dataplus._M_p = (pointer)&req.instance_id11.field_2
                            ;
                            req.instance_id11._M_string_length = 0;
                            req.instance_id11.field_2._M_local_buf[0] = '\0';
                            req.instance_id12._M_dataplus._M_p = (pointer)&req.instance_id12.field_2
                            ;
                            req.instance_id12._M_string_length = 0;
                            req.instance_id12.field_2._M_local_buf[0] = '\0';
                            req.instance_id13._M_dataplus._M_p = (pointer)&req.instance_id13.field_2
                            ;
                            req.instance_id13._M_string_length = 0;
                            req.instance_id13.field_2._M_local_buf[0] = '\0';
                            req.instance_id14._M_dataplus._M_p = (pointer)&req.instance_id14.field_2
                            ;
                            req.instance_id14._M_string_length = 0;
                            req.instance_id14.field_2._M_local_buf[0] = '\0';
                            req.instance_id15._M_dataplus._M_p = (pointer)&req.instance_id15.field_2
                            ;
                            req.instance_id15._M_string_length = 0;
                            req.instance_id15.field_2._M_local_buf[0] = '\0';
                            req.instance_id16._M_dataplus._M_p = (pointer)&req.instance_id16.field_2
                            ;
                            req.instance_id16._M_string_length = 0;
                            req.instance_id16.field_2._M_local_buf[0] = '\0';
                            req.instance_id17._M_dataplus._M_p = (pointer)&req.instance_id17.field_2
                            ;
                            req.instance_id17._M_string_length = 0;
                            req.instance_id17.field_2._M_local_buf[0] = '\0';
                            req.instance_id18._M_dataplus._M_p = (pointer)&req.instance_id18.field_2
                            ;
                            req.instance_id18._M_string_length = 0;
                            req.instance_id18.field_2._M_local_buf[0] = '\0';
                            req.instance_id19._M_dataplus._M_p = (pointer)&req.instance_id19.field_2
                            ;
                            req.instance_id19._M_string_length = 0;
                            req.instance_id19.field_2._M_local_buf[0] = '\0';
                            req.instance_id20._M_dataplus._M_p = (pointer)&req.instance_id20.field_2
                            ;
                            req.instance_id20._M_string_length = 0;
                            req.instance_id20.field_2._M_local_buf[0] = '\0';
                            req.owner_account._M_dataplus._M_p = (pointer)&req.owner_account.field_2
                            ;
                            req.owner_account._M_string_length = 0;
                            req.owner_account.field_2._M_local_buf[0] = '\0';
                            local_550._M_p = (pointer)&local_540;
                            local_548 = 0;
                            local_540._M_local_buf[0] = '\0';
                            local_530._M_p = (pointer)&local_520;
                            local_528 = 0;
                            local_520._M_local_buf[0] = '\0';
                            local_510._M_p = (pointer)&local_500;
                            local_508 = 0;
                            local_500._M_local_buf[0] = '\0';
                            local_4f0._M_p = (pointer)&local_4e0;
                            local_4e8 = 0;
                            local_4e0._M_local_buf[0] = '\0';
                            local_4d0._M_p = (pointer)&local_4c0;
                            local_4c8 = 0;
                            local_4c0._M_local_buf[0] = '\0';
                            local_4b0._M_p = (pointer)&local_4a0;
                            local_4a8 = 0;
                            local_4a0._M_local_buf[0] = '\0';
                            local_490._M_p = (pointer)&local_480;
                            local_488 = 0;
                            local_480._M_local_buf[0] = '\0';
                            local_470._M_p = (pointer)&local_460;
                            local_468 = 0;
                            local_460._M_local_buf[0] = '\0';
                            local_448 = 0;
                            local_440._M_local_buf[0] = '\0';
                            local_428 = 0;
                            local_420._M_local_buf[0] = '\0';
                            local_408 = 0;
                            local_400._M_local_buf[0] = '\0';
                            local_3e8 = 0;
                            local_3e0._M_local_buf[0] = '\0';
                            resp.scaling_activity_id._M_dataplus._M_p = (pointer)0x0;
                            resp.scaling_activity_id._M_string_length = 0;
                            resp.scaling_activity_id.field_2._M_allocated_capacity = 0;
                            local_450._M_p = (pointer)&local_440;
                            local_430._M_p = (pointer)&local_420;
                            local_410._M_p = (pointer)&local_400;
                            local_3f0._M_p = (pointer)&local_3e0;
                            std::__cxx11::string::string<std::allocator<char>>
                                      (local_8f8,"cn-hangzhou",(allocator<char> *)&local_958);
                            std::__cxx11::string::string<std::allocator<char>>
                                      (local_918,"my_appid",(allocator<char> *)&resp_5);
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_8d8,"my_secret",&local_959);
                            this = (EssDescribeScheduledTasksRequestType *)
                                   aliyun::Ess::CreateEssClient(local_8f8,local_918,&local_8d8);
                            std::__cxx11::string::~string((string *)&local_8d8);
                            std::__cxx11::string::~string(local_918);
                            std::__cxx11::string::~string(local_8f8);
                            if (this == (EssDescribeScheduledTasksRequestType *)0x0) {
                              std::
                              vector<aliyun::EssDescribeScalingRulesScalingRuleType,_std::allocator<aliyun::EssDescribeScalingRulesScalingRuleType>_>
                              ::~vector((vector<aliyun::EssDescribeScalingRulesScalingRuleType,_std::allocator<aliyun::EssDescribeScalingRulesScalingRuleType>_>
                                         *)&resp);
                              aliyun::EssDescribeScalingRulesRequestType::
                              ~EssDescribeScalingRulesRequestType
                                        ((EssDescribeScalingRulesRequestType *)&req);
                              req.owner_id._M_dataplus._M_p = (pointer)&req.owner_id.field_2;
                              req.owner_id._M_string_length = 0;
                              req.owner_id.field_2._M_local_buf[0] = '\0';
                              req.resource_owner_account._M_dataplus._M_p =
                                   (pointer)&req.resource_owner_account.field_2;
                              req.resource_owner_account._M_string_length = 0;
                              req.resource_owner_account.field_2._M_local_buf[0] = '\0';
                              req.resource_owner_id._M_dataplus._M_p =
                                   (pointer)&req.resource_owner_id.field_2;
                              req.resource_owner_id._M_string_length = 0;
                              req.resource_owner_id.field_2._M_local_buf[0] = '\0';
                              req.scaling_group_id._M_dataplus._M_p =
                                   (pointer)&req.scaling_group_id.field_2;
                              req.scaling_group_id._M_string_length = 0;
                              req.scaling_group_id.field_2._M_local_buf[0] = '\0';
                              req.instance_id1._M_dataplus._M_p = (pointer)&req.instance_id1.field_2
                              ;
                              req.instance_id1._M_string_length = 0;
                              req.instance_id1.field_2._M_local_buf[0] = '\0';
                              req.instance_id2._M_dataplus._M_p = (pointer)&req.instance_id2.field_2
                              ;
                              req.instance_id2._M_string_length = 0;
                              req.instance_id2.field_2._M_local_buf[0] = '\0';
                              req.instance_id3._M_dataplus._M_p = (pointer)&req.instance_id3.field_2
                              ;
                              req.instance_id3._M_string_length = 0;
                              req.instance_id3.field_2._M_local_buf[0] = '\0';
                              req.instance_id4._M_dataplus._M_p = (pointer)&req.instance_id4.field_2
                              ;
                              req.instance_id4._M_string_length = 0;
                              req.instance_id4.field_2._M_local_buf[0] = '\0';
                              req.instance_id5._M_dataplus._M_p = (pointer)&req.instance_id5.field_2
                              ;
                              req.instance_id5._M_string_length = 0;
                              req.instance_id5.field_2._M_local_buf[0] = '\0';
                              req.instance_id6._M_dataplus._M_p = (pointer)&req.instance_id6.field_2
                              ;
                              req.instance_id6._M_string_length = 0;
                              req.instance_id6.field_2._M_local_buf[0] = '\0';
                              req.instance_id7._M_dataplus._M_p = (pointer)&req.instance_id7.field_2
                              ;
                              req.instance_id7._M_string_length = 0;
                              req.instance_id7.field_2._M_local_buf[0] = '\0';
                              req.instance_id8._M_dataplus._M_p = (pointer)&req.instance_id8.field_2
                              ;
                              req.instance_id8._M_string_length = 0;
                              req.instance_id8.field_2._M_local_buf[0] = '\0';
                              req.instance_id9._M_dataplus._M_p = (pointer)&req.instance_id9.field_2
                              ;
                              req.instance_id9._M_string_length = 0;
                              req.instance_id9.field_2._M_local_buf[0] = '\0';
                              req.instance_id10._M_dataplus._M_p =
                                   (pointer)&req.instance_id10.field_2;
                              req.instance_id10._M_string_length = 0;
                              req.instance_id10.field_2._M_local_buf[0] = '\0';
                              req.instance_id11._M_dataplus._M_p =
                                   (pointer)&req.instance_id11.field_2;
                              req.instance_id11._M_string_length = 0;
                              req.instance_id11.field_2._M_local_buf[0] = '\0';
                              req.instance_id12._M_dataplus._M_p =
                                   (pointer)&req.instance_id12.field_2;
                              req.instance_id12._M_string_length = 0;
                              req.instance_id12.field_2._M_local_buf[0] = '\0';
                              req.instance_id13._M_dataplus._M_p =
                                   (pointer)&req.instance_id13.field_2;
                              req.instance_id13._M_string_length = 0;
                              req.instance_id13.field_2._M_local_buf[0] = '\0';
                              req.instance_id14._M_dataplus._M_p =
                                   (pointer)&req.instance_id14.field_2;
                              req.instance_id14._M_string_length = 0;
                              req.instance_id14.field_2._M_local_buf[0] = '\0';
                              req.instance_id15._M_dataplus._M_p =
                                   (pointer)&req.instance_id15.field_2;
                              req.instance_id15._M_string_length = 0;
                              req.instance_id15.field_2._M_local_buf[0] = '\0';
                              req.instance_id16._M_dataplus._M_p =
                                   (pointer)&req.instance_id16.field_2;
                              req.instance_id16._M_string_length = 0;
                              req.instance_id16.field_2._M_local_buf[0] = '\0';
                              req.instance_id17._M_dataplus._M_p =
                                   (pointer)&req.instance_id17.field_2;
                              req.instance_id17._M_string_length = 0;
                              req.instance_id17.field_2._M_local_buf[0] = '\0';
                              req.instance_id18._M_dataplus._M_p =
                                   (pointer)&req.instance_id18.field_2;
                              req.instance_id18._M_string_length = 0;
                              req.instance_id18.field_2._M_local_buf[0] = '\0';
                              req.instance_id19._M_dataplus._M_p =
                                   (pointer)&req.instance_id19.field_2;
                              req.instance_id19._M_string_length = 0;
                              req.instance_id19.field_2._M_local_buf[0] = '\0';
                              req.instance_id20._M_dataplus._M_p =
                                   (pointer)&req.instance_id20.field_2;
                              req.instance_id20._M_string_length = 0;
                              req.instance_id20.field_2._M_local_buf[0] = '\0';
                              req.owner_account._M_dataplus._M_p =
                                   (pointer)&req.owner_account.field_2;
                              req.owner_account._M_string_length = 0;
                              req.owner_account.field_2._M_local_buf[0] = '\0';
                              local_550._M_p = (pointer)&local_540;
                              local_548 = 0;
                              local_540._M_local_buf[0] = '\0';
                              local_530._M_p = (pointer)&local_520;
                              local_528 = 0;
                              local_520._M_local_buf[0] = '\0';
                              local_510._M_p = (pointer)&local_500;
                              local_508 = 0;
                              local_500._M_local_buf[0] = '\0';
                              local_4f0._M_p = (pointer)&local_4e0;
                              local_4e8 = 0;
                              local_4e0._M_local_buf[0] = '\0';
                              local_4d0._M_p = (pointer)&local_4c0;
                              local_4c8 = 0;
                              local_4c0._M_local_buf[0] = '\0';
                              local_4b0._M_p = (pointer)&local_4a0;
                              local_4a8 = 0;
                              local_4a0._M_local_buf[0] = '\0';
                              local_490._M_p = (pointer)&local_480;
                              local_488 = 0;
                              local_480._M_local_buf[0] = '\0';
                              local_470._M_p = (pointer)&local_460;
                              local_468 = 0;
                              local_460._M_local_buf[0] = '\0';
                              local_448 = 0;
                              local_440._M_local_buf[0] = '\0';
                              local_428 = 0;
                              local_420._M_local_buf[0] = '\0';
                              local_408 = 0;
                              local_400._M_local_buf[0] = '\0';
                              local_3e8 = 0;
                              local_3e0._M_local_buf[0] = '\0';
                              local_3d0._M_p = (pointer)&local_3c0;
                              local_3c8 = 0;
                              local_3c0._M_local_buf[0] = '\0';
                              local_3b0._M_p = (pointer)&local_3a0;
                              local_3a8 = 0;
                              local_3a0._M_local_buf[0] = '\0';
                              local_390._M_p = (pointer)&local_380;
                              local_388 = 0;
                              local_380._M_local_buf[0] = '\0';
                              local_370._M_p = (pointer)&local_360;
                              local_368 = 0;
                              local_360._M_local_buf[0] = '\0';
                              local_350._M_p = (pointer)&local_340;
                              local_348 = 0;
                              local_340._M_local_buf[0] = '\0';
                              local_330._M_p = (pointer)&local_320;
                              local_328 = 0;
                              local_320._M_local_buf[0] = '\0';
                              local_310._M_p = (pointer)&local_300;
                              local_308 = 0;
                              local_300._M_local_buf[0] = '\0';
                              local_2f0._M_p = (pointer)&local_2e0;
                              local_2e8 = 0;
                              local_2e0._M_local_buf[0] = '\0';
                              local_2d0._M_p = (pointer)&local_2c0;
                              local_2c8 = 0;
                              local_2c0._M_local_buf[0] = '\0';
                              local_2b0._M_p = (pointer)&local_2a0;
                              local_2a8 = 0;
                              local_2a0._M_local_buf[0] = '\0';
                              local_290._M_p = (pointer)&local_280;
                              local_288 = 0;
                              local_280._M_local_buf[0] = '\0';
                              local_270._M_p = (pointer)&local_260;
                              local_268 = 0;
                              local_260._M_local_buf[0] = '\0';
                              local_250._M_p = (pointer)&local_240;
                              local_248 = 0;
                              local_240._M_local_buf[0] = '\0';
                              local_230._M_p = (pointer)&local_220;
                              local_228 = 0;
                              local_220._M_local_buf[0] = '\0';
                              local_210._M_p = (pointer)&local_200;
                              local_208 = 0;
                              local_200._M_local_buf[0] = '\0';
                              local_1f0._M_p = (pointer)&local_1e0;
                              local_1e8 = 0;
                              local_1e0._M_local_buf[0] = '\0';
                              local_1d0._M_p = (pointer)&local_1c0;
                              local_1c8 = 0;
                              local_1c0._M_local_buf[0] = '\0';
                              local_1b0._M_p = (pointer)&local_1a0;
                              local_1a8 = 0;
                              local_1a0._M_local_buf[0] = '\0';
                              local_190._M_p = (pointer)&local_180;
                              local_188 = 0;
                              local_180._M_local_buf[0] = '\0';
                              local_170._M_p = (pointer)&local_160;
                              local_168 = 0;
                              local_160._M_local_buf[0] = '\0';
                              local_150._M_p = (pointer)&local_140;
                              local_148 = 0;
                              local_140._M_local_buf[0] = '\0';
                              local_130._M_p = (pointer)&local_120;
                              local_128 = 0;
                              local_120._M_local_buf[0] = '\0';
                              local_110._M_p = (pointer)&local_100;
                              local_108 = 0;
                              local_100._M_local_buf[0] = '\0';
                              local_f0._M_p = (pointer)&local_e0;
                              local_e8 = 0;
                              local_e0._M_local_buf[0] = '\0';
                              local_d0._M_p = (pointer)&local_c0;
                              local_c8 = 0;
                              local_c0._M_local_buf[0] = '\0';
                              local_b0._M_p = (pointer)&local_a0;
                              local_a8 = 0;
                              local_a0._M_local_buf[0] = '\0';
                              local_90._M_p = (pointer)&local_80;
                              local_88 = 0;
                              local_80._M_local_buf[0] = '\0';
                              local_70._M_p = (pointer)&local_60;
                              local_68 = 0;
                              local_60._M_local_buf[0] = '\0';
                              local_50._M_p = (pointer)&local_40;
                              local_48 = 0;
                              local_40._M_local_buf[0] = '\0';
                              resp.scaling_activity_id._M_dataplus._M_p = (pointer)0x0;
                              resp.scaling_activity_id._M_string_length = 0;
                              resp.scaling_activity_id.field_2._M_allocated_capacity = 0;
                              local_450._M_p = (pointer)&local_440;
                              local_430._M_p = (pointer)&local_420;
                              local_410._M_p = (pointer)&local_400;
                              local_3f0._M_p = (pointer)&local_3e0;
                              std::__cxx11::string::string<std::allocator<char>>
                                        (local_8f8,"cn-hangzhou",(allocator<char> *)&local_958);
                              std::__cxx11::string::string<std::allocator<char>>
                                        (local_918,"my_appid",(allocator<char> *)&resp_5);
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_8d8,"my_secret",&local_959);
                              paVar1 = &req.owner_id.field_2;
                              paVar2 = &req.resource_owner_account.field_2;
                              paVar3 = &req.resource_owner_id.field_2;
                              paVar4 = &req.scaling_group_id.field_2;
                              this = (EssDescribeScheduledTasksRequestType *)
                                     aliyun::Ess::CreateEssClient(local_8f8,local_918,&local_8d8);
                              std::__cxx11::string::~string((string *)&local_8d8);
                              std::__cxx11::string::~string(local_918);
                              std::__cxx11::string::~string(local_8f8);
                              if (this == (EssDescribeScheduledTasksRequestType *)0x0) {
                                std::
                                vector<aliyun::EssDescribeScheduledTasksScheduledTaskType,_std::allocator<aliyun::EssDescribeScheduledTasksScheduledTaskType>_>
                                ::~vector((vector<aliyun::EssDescribeScheduledTasksScheduledTaskType,_std::allocator<aliyun::EssDescribeScheduledTasksScheduledTaskType>_>
                                           *)&resp);
                                aliyun::EssDescribeScheduledTasksRequestType::
                                ~EssDescribeScheduledTasksRequestType
                                          ((EssDescribeScheduledTasksRequestType *)&req);
                                req.owner_id._M_string_length = 0;
                                req.owner_id.field_2._M_local_buf[0] = '\0';
                                req.resource_owner_account._M_string_length = 0;
                                req.resource_owner_account.field_2._M_local_buf[0] = '\0';
                                req.resource_owner_id._M_string_length = 0;
                                req.resource_owner_id.field_2._M_local_buf[0] = '\0';
                                req.scaling_group_id._M_string_length = 0;
                                req.scaling_group_id.field_2._M_local_buf[0] = '\0';
                                req.instance_id1._M_dataplus._M_p =
                                     (pointer)&req.instance_id1.field_2;
                                req.instance_id1._M_string_length = 0;
                                req.instance_id1.field_2._M_local_buf[0] = '\0';
                                req.instance_id2._M_dataplus._M_p =
                                     (pointer)&req.instance_id2.field_2;
                                req.instance_id2._M_string_length = 0;
                                req.instance_id2.field_2._M_local_buf[0] = '\0';
                                req.instance_id3._M_dataplus._M_p =
                                     (pointer)&req.instance_id3.field_2;
                                req.instance_id3._M_string_length = 0;
                                req.instance_id3.field_2._M_local_buf[0] = '\0';
                                req.instance_id4._M_dataplus._M_p =
                                     (pointer)&req.instance_id4.field_2;
                                req.instance_id4._M_string_length = 0;
                                req.instance_id4.field_2._M_local_buf[0] = '\0';
                                req.instance_id5._M_dataplus._M_p =
                                     (pointer)&req.instance_id5.field_2;
                                req.instance_id5._M_string_length = 0;
                                req.instance_id5.field_2._M_local_buf[0] = '\0';
                                req.instance_id6._M_dataplus._M_p =
                                     (pointer)&req.instance_id6.field_2;
                                req.instance_id6._M_string_length = 0;
                                req.instance_id6.field_2._M_local_buf[0] = '\0';
                                req.instance_id7._M_dataplus._M_p =
                                     (pointer)&req.instance_id7.field_2;
                                req.instance_id7._M_string_length = 0;
                                req.instance_id7.field_2._M_local_buf[0] = '\0';
                                req.instance_id8._M_dataplus._M_p =
                                     (pointer)&req.instance_id8.field_2;
                                req.instance_id8._M_string_length = 0;
                                req.instance_id8.field_2._M_local_buf[0] = '\0';
                                req.instance_id9._M_dataplus._M_p =
                                     (pointer)&req.instance_id9.field_2;
                                req.instance_id9._M_string_length = 0;
                                req.instance_id9.field_2._M_local_buf[0] = '\0';
                                req.instance_id10._M_dataplus._M_p =
                                     (pointer)&req.instance_id10.field_2;
                                req.instance_id10._M_string_length = 0;
                                req.instance_id10.field_2._M_local_buf[0] = '\0';
                                req.instance_id11._M_dataplus._M_p =
                                     (pointer)&req.instance_id11.field_2;
                                req.instance_id11._M_string_length = 0;
                                req.instance_id11.field_2._M_local_buf[0] = '\0';
                                req.instance_id12._M_dataplus._M_p =
                                     (pointer)&req.instance_id12.field_2;
                                req.instance_id12._M_string_length = 0;
                                req.instance_id12.field_2._M_local_buf[0] = '\0';
                                req.instance_id13._M_dataplus._M_p =
                                     (pointer)&req.instance_id13.field_2;
                                req.instance_id13._M_string_length = 0;
                                req.instance_id13.field_2._M_local_buf[0] = '\0';
                                req.instance_id14._M_dataplus._M_p =
                                     (pointer)&req.instance_id14.field_2;
                                req.instance_id14._M_string_length = 0;
                                req.instance_id14.field_2._M_local_buf[0] = '\0';
                                req.instance_id15._M_dataplus._M_p =
                                     (pointer)&req.instance_id15.field_2;
                                req.instance_id15._M_string_length = 0;
                                req.instance_id15.field_2._M_local_buf[0] = '\0';
                                req.instance_id16._M_dataplus._M_p =
                                     (pointer)&req.instance_id16.field_2;
                                req.instance_id16._M_string_length = 0;
                                req.instance_id16.field_2._M_local_buf[0] = '\0';
                                req.instance_id17._M_dataplus._M_p =
                                     (pointer)&req.instance_id17.field_2;
                                req.instance_id17._M_string_length = 0;
                                req.instance_id17.field_2._M_local_buf[0] = '\0';
                                req.instance_id18._M_dataplus._M_p =
                                     (pointer)&req.instance_id18.field_2;
                                req.instance_id18._M_string_length = 0;
                                req.instance_id18.field_2._M_local_buf[0] = '\0';
                                req.instance_id19._M_dataplus._M_p =
                                     (pointer)&req.instance_id19.field_2;
                                req.instance_id19._M_string_length = 0;
                                req.instance_id19.field_2._M_local_buf[0] = '\0';
                                req.instance_id20._M_dataplus._M_p =
                                     (pointer)&req.instance_id20.field_2;
                                req.instance_id20._M_string_length = 0;
                                req.instance_id20.field_2._M_local_buf[0] = '\0';
                                req.owner_account._M_dataplus._M_p =
                                     (pointer)&req.owner_account.field_2;
                                req.owner_account._M_string_length = 0;
                                req.owner_account.field_2._M_local_buf[0] = '\0';
                                resp.scaling_activity_id._M_dataplus._M_p =
                                     (pointer)&resp.scaling_activity_id.field_2;
                                resp.scaling_activity_id._M_string_length = 0;
                                resp.scaling_activity_id.field_2._M_allocated_capacity =
                                     resp.scaling_activity_id.field_2._M_allocated_capacity &
                                     0xffffffffffffff00;
                                req.owner_id._M_dataplus._M_p = (pointer)paVar1;
                                req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
                                req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
                                req.scaling_group_id._M_dataplus._M_p = (pointer)paVar4;
                                std::__cxx11::string::string<std::allocator<char>>
                                          (local_8f8,"cn-hangzhou",(allocator<char> *)&local_958);
                                std::__cxx11::string::string<std::allocator<char>>
                                          (local_918,"my_appid",(allocator<char> *)&resp_5);
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_8d8,"my_secret",&local_959);
                                this = (EssDescribeScheduledTasksRequestType *)
                                       aliyun::Ess::CreateEssClient(local_8f8,local_918,&local_8d8);
                                std::__cxx11::string::~string((string *)&local_8d8);
                                std::__cxx11::string::~string(local_918);
                                std::__cxx11::string::~string(local_8f8);
                                if (this == (EssDescribeScheduledTasksRequestType *)0x0) {
                                  std::__cxx11::string::~string((string *)&resp);
                                  aliyun::EssDetachInstancesRequestType::
                                  ~EssDetachInstancesRequestType
                                            ((EssDetachInstancesRequestType *)&req);
                                  req.owner_id._M_string_length = 0;
                                  req.owner_id.field_2._M_local_buf[0] = '\0';
                                  req.resource_owner_account._M_string_length = 0;
                                  req.resource_owner_account.field_2._M_local_buf[0] = '\0';
                                  req.resource_owner_id._M_string_length = 0;
                                  req.resource_owner_id.field_2._M_local_buf[0] = '\0';
                                  req.scaling_group_id._M_string_length = 0;
                                  req.scaling_group_id.field_2._M_local_buf[0] = '\0';
                                  req.instance_id1._M_dataplus._M_p =
                                       (pointer)&req.instance_id1.field_2;
                                  req.instance_id1._M_string_length = 0;
                                  req.instance_id1.field_2._M_local_buf[0] = '\0';
                                  req.owner_id._M_dataplus._M_p = (pointer)paVar1;
                                  req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
                                  req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
                                  req.scaling_group_id._M_dataplus._M_p = (pointer)paVar4;
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&resp,"cn-hangzhou",
                                             (allocator<char> *)&local_8d8);
                                  std::__cxx11::string::string<std::allocator<char>>
                                            (local_8f8,"my_appid",(allocator<char> *)&local_958);
                                  std::__cxx11::string::string<std::allocator<char>>
                                            (local_918,"my_secret",&local_959);
                                  this = (EssDescribeScheduledTasksRequestType *)
                                         aliyun::Ess::CreateEssClient(&resp,local_8f8,local_918);
                                  std::__cxx11::string::~string(local_918);
                                  std::__cxx11::string::~string(local_8f8);
                                  std::__cxx11::string::~string((string *)&resp);
                                  if (this == (EssDescribeScheduledTasksRequestType *)0x0) {
                                    aliyun::EssDisableScalingGroupRequestType::
                                    ~EssDisableScalingGroupRequestType
                                              ((EssDisableScalingGroupRequestType *)&req);
                                    req.owner_id._M_string_length = 0;
                                    req.owner_id.field_2._M_local_buf[0] = '\0';
                                    req.resource_owner_account._M_string_length = 0;
                                    req.resource_owner_account.field_2._M_local_buf[0] = '\0';
                                    req.resource_owner_id._M_string_length = 0;
                                    req.resource_owner_id.field_2._M_local_buf[0] = '\0';
                                    req.scaling_group_id._M_string_length = 0;
                                    req.scaling_group_id.field_2._M_local_buf[0] = '\0';
                                    req.instance_id1._M_dataplus._M_p =
                                         (pointer)&req.instance_id1.field_2;
                                    req.instance_id1._M_string_length = 0;
                                    req.instance_id1.field_2._M_local_buf[0] = '\0';
                                    req.instance_id2._M_dataplus._M_p =
                                         (pointer)&req.instance_id2.field_2;
                                    req.instance_id2._M_string_length = 0;
                                    req.instance_id2.field_2._M_local_buf[0] = '\0';
                                    req.instance_id3._M_dataplus._M_p =
                                         (pointer)&req.instance_id3.field_2;
                                    req.instance_id3._M_string_length = 0;
                                    req.instance_id3.field_2._M_local_buf[0] = '\0';
                                    req.instance_id4._M_dataplus._M_p =
                                         (pointer)&req.instance_id4.field_2;
                                    req.instance_id4._M_string_length = 0;
                                    req.instance_id4.field_2._M_local_buf[0] = '\0';
                                    req.instance_id5._M_dataplus._M_p =
                                         (pointer)&req.instance_id5.field_2;
                                    req.instance_id5._M_string_length = 0;
                                    req.instance_id5.field_2._M_local_buf[0] = '\0';
                                    req.instance_id6._M_dataplus._M_p =
                                         (pointer)&req.instance_id6.field_2;
                                    req.instance_id6._M_string_length = 0;
                                    req.instance_id6.field_2._M_local_buf[0] = '\0';
                                    req.instance_id7._M_dataplus._M_p =
                                         (pointer)&req.instance_id7.field_2;
                                    req.instance_id7._M_string_length = 0;
                                    req.instance_id7.field_2._M_local_buf[0] = '\0';
                                    req.instance_id8._M_dataplus._M_p =
                                         (pointer)&req.instance_id8.field_2;
                                    req.instance_id8._M_string_length = 0;
                                    req.instance_id8.field_2._M_local_buf[0] = '\0';
                                    req.instance_id9._M_dataplus._M_p =
                                         (pointer)&req.instance_id9.field_2;
                                    req.instance_id9._M_string_length = 0;
                                    req.instance_id9.field_2._M_local_buf[0] = '\0';
                                    req.instance_id10._M_dataplus._M_p =
                                         (pointer)&req.instance_id10.field_2;
                                    req.instance_id10._M_string_length = 0;
                                    req.instance_id10.field_2._M_local_buf[0] = '\0';
                                    req.instance_id11._M_dataplus._M_p =
                                         (pointer)&req.instance_id11.field_2;
                                    req.instance_id11._M_string_length = 0;
                                    req.instance_id11.field_2._M_local_buf[0] = '\0';
                                    req.instance_id12._M_dataplus._M_p =
                                         (pointer)&req.instance_id12.field_2;
                                    req.instance_id12._M_string_length = 0;
                                    req.instance_id12.field_2._M_local_buf[0] = '\0';
                                    req.instance_id13._M_dataplus._M_p =
                                         (pointer)&req.instance_id13.field_2;
                                    req.instance_id13._M_string_length = 0;
                                    req.instance_id13.field_2._M_local_buf[0] = '\0';
                                    req.instance_id14._M_dataplus._M_p =
                                         (pointer)&req.instance_id14.field_2;
                                    req.instance_id14._M_string_length = 0;
                                    req.instance_id14.field_2._M_local_buf[0] = '\0';
                                    req.instance_id15._M_dataplus._M_p =
                                         (pointer)&req.instance_id15.field_2;
                                    req.instance_id15._M_string_length = 0;
                                    req.instance_id15.field_2._M_local_buf[0] = '\0';
                                    req.instance_id16._M_dataplus._M_p =
                                         (pointer)&req.instance_id16.field_2;
                                    req.instance_id16._M_string_length = 0;
                                    req.instance_id16.field_2._M_local_buf[0] = '\0';
                                    req.instance_id17._M_dataplus._M_p =
                                         (pointer)&req.instance_id17.field_2;
                                    req.instance_id17._M_string_length = 0;
                                    req.instance_id17.field_2._M_local_buf[0] = '\0';
                                    req.instance_id18._M_dataplus._M_p =
                                         (pointer)&req.instance_id18.field_2;
                                    req.instance_id18._M_string_length = 0;
                                    req.instance_id18.field_2._M_local_buf[0] = '\0';
                                    req.instance_id19._M_dataplus._M_p =
                                         (pointer)&req.instance_id19.field_2;
                                    req.instance_id19._M_string_length = 0;
                                    req.instance_id19.field_2._M_local_buf[0] = '\0';
                                    req.instance_id20._M_dataplus._M_p =
                                         (pointer)&req.instance_id20.field_2;
                                    req.instance_id20._M_string_length = 0;
                                    req.instance_id20.field_2._M_local_buf[0] = '\0';
                                    req.owner_account._M_dataplus._M_p =
                                         (pointer)&req.owner_account.field_2;
                                    req.owner_account._M_string_length = 0;
                                    req.owner_account.field_2._M_local_buf[0] = '\0';
                                    local_550._M_p = (pointer)&local_540;
                                    local_548 = 0;
                                    local_540._M_local_buf[0] = '\0';
                                    req.owner_id._M_dataplus._M_p = (pointer)paVar1;
                                    req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
                                    req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
                                    req.scaling_group_id._M_dataplus._M_p = (pointer)paVar4;
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&resp,"cn-hangzhou",
                                               (allocator<char> *)&local_8d8);
                                    std::__cxx11::string::string<std::allocator<char>>
                                              (local_8f8,"my_appid",(allocator<char> *)&local_958);
                                    std::__cxx11::string::string<std::allocator<char>>
                                              (local_918,"my_secret",&local_959);
                                    this = (EssDescribeScheduledTasksRequestType *)
                                           aliyun::Ess::CreateEssClient(&resp,local_8f8,local_918);
                                    std::__cxx11::string::~string(local_918);
                                    std::__cxx11::string::~string(local_8f8);
                                    std::__cxx11::string::~string((string *)&resp);
                                    if (this == (EssDescribeScheduledTasksRequestType *)0x0) {
                                      aliyun::EssEnableScalingGroupRequestType::
                                      ~EssEnableScalingGroupRequestType
                                                ((EssEnableScalingGroupRequestType *)&req);
                                      req.owner_id._M_string_length = 0;
                                      req.owner_id.field_2._M_local_buf[0] = '\0';
                                      req.resource_owner_account._M_string_length = 0;
                                      req.resource_owner_account.field_2._M_local_buf[0] = '\0';
                                      req.resource_owner_id._M_string_length = 0;
                                      req.resource_owner_id.field_2._M_local_buf[0] = '\0';
                                      req.scaling_group_id._M_string_length = 0;
                                      req.scaling_group_id.field_2._M_local_buf[0] = '\0';
                                      req.instance_id1._M_dataplus._M_p =
                                           (pointer)&req.instance_id1.field_2;
                                      req.instance_id1._M_string_length = 0;
                                      req.instance_id1.field_2._M_local_buf[0] = '\0';
                                      req.instance_id2._M_dataplus._M_p =
                                           (pointer)&req.instance_id2.field_2;
                                      req.instance_id2._M_string_length = 0;
                                      req.instance_id2.field_2._M_local_buf[0] = '\0';
                                      resp.scaling_activity_id._M_dataplus._M_p =
                                           (pointer)&resp.scaling_activity_id.field_2;
                                      resp.scaling_activity_id._M_string_length = 0;
                                      resp.scaling_activity_id.field_2._M_allocated_capacity =
                                           resp.scaling_activity_id.field_2._M_allocated_capacity &
                                           0xffffffffffffff00;
                                      req.owner_id._M_dataplus._M_p = (pointer)paVar1;
                                      req.resource_owner_account._M_dataplus._M_p = (pointer)paVar2;
                                      req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
                                      req.scaling_group_id._M_dataplus._M_p = (pointer)paVar4;
                                      std::__cxx11::string::string<std::allocator<char>>
                                                (local_8f8,"cn-hangzhou",
                                                 (allocator<char> *)&local_958);
                                      std::__cxx11::string::string<std::allocator<char>>
                                                (local_918,"my_appid",(allocator<char> *)&resp_5);
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)&local_8d8,"my_secret",&local_959);
                                      this = (EssDescribeScheduledTasksRequestType *)
                                             aliyun::Ess::CreateEssClient
                                                       (local_8f8,local_918,&local_8d8);
                                      std::__cxx11::string::~string((string *)&local_8d8);
                                      std::__cxx11::string::~string(local_918);
                                      std::__cxx11::string::~string(local_8f8);
                                      if (this == (EssDescribeScheduledTasksRequestType *)0x0) {
                                        std::__cxx11::string::~string((string *)&resp);
                                        aliyun::EssExecuteScalingRuleRequestType::
                                        ~EssExecuteScalingRuleRequestType
                                                  ((EssExecuteScalingRuleRequestType *)&req);
                                        req.owner_id._M_string_length = 0;
                                        req.owner_id.field_2._M_local_buf[0] = '\0';
                                        req.resource_owner_account._M_string_length = 0;
                                        req.resource_owner_account.field_2._M_local_buf[0] = '\0';
                                        req.resource_owner_id._M_string_length = 0;
                                        req.resource_owner_id.field_2._M_local_buf[0] = '\0';
                                        req.scaling_group_id._M_string_length = 0;
                                        req.scaling_group_id.field_2._M_local_buf[0] = '\0';
                                        req.instance_id1._M_dataplus._M_p =
                                             (pointer)&req.instance_id1.field_2;
                                        req.instance_id1._M_string_length = 0;
                                        req.instance_id1.field_2._M_local_buf[0] = '\0';
                                        req.instance_id2._M_dataplus._M_p =
                                             (pointer)&req.instance_id2.field_2;
                                        req.instance_id2._M_string_length = 0;
                                        req.instance_id2.field_2._M_local_buf[0] = '\0';
                                        req.instance_id3._M_dataplus._M_p =
                                             (pointer)&req.instance_id3.field_2;
                                        req.instance_id3._M_string_length = 0;
                                        req.instance_id3.field_2._M_local_buf[0] = '\0';
                                        req.instance_id4._M_dataplus._M_p =
                                             (pointer)&req.instance_id4.field_2;
                                        req.instance_id4._M_string_length = 0;
                                        req.instance_id4.field_2._M_local_buf[0] = '\0';
                                        req.instance_id5._M_dataplus._M_p =
                                             (pointer)&req.instance_id5.field_2;
                                        req.instance_id5._M_string_length = 0;
                                        req.instance_id5.field_2._M_local_buf[0] = '\0';
                                        req.instance_id6._M_dataplus._M_p =
                                             (pointer)&req.instance_id6.field_2;
                                        req.instance_id6._M_string_length = 0;
                                        req.instance_id6.field_2._M_local_buf[0] = '\0';
                                        req.instance_id7._M_dataplus._M_p =
                                             (pointer)&req.instance_id7.field_2;
                                        req.instance_id7._M_string_length = 0;
                                        req.instance_id7.field_2._M_local_buf[0] = '\0';
                                        req.instance_id8._M_dataplus._M_p =
                                             (pointer)&req.instance_id8.field_2;
                                        req.instance_id8._M_string_length = 0;
                                        req.instance_id8.field_2._M_local_buf[0] = '\0';
                                        req.owner_id._M_dataplus._M_p = (pointer)paVar1;
                                        req.resource_owner_account._M_dataplus._M_p =
                                             (pointer)paVar2;
                                        req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
                                        req.scaling_group_id._M_dataplus._M_p = (pointer)paVar4;
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&resp,"cn-hangzhou",
                                                   (allocator<char> *)&local_8d8);
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  (local_8f8,"my_appid",
                                                   (allocator<char> *)&local_958);
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  (local_918,"my_secret",&local_959);
                                        this = (EssDescribeScheduledTasksRequestType *)
                                               aliyun::Ess::CreateEssClient
                                                         (&resp,local_8f8,local_918);
                                        std::__cxx11::string::~string(local_918);
                                        std::__cxx11::string::~string(local_8f8);
                                        std::__cxx11::string::~string((string *)&resp);
                                        if (this == (EssDescribeScheduledTasksRequestType *)0x0) {
                                          aliyun::EssModifyScalingGroupRequestType::
                                          ~EssModifyScalingGroupRequestType
                                                    ((EssModifyScalingGroupRequestType *)&req);
                                          req.owner_id._M_string_length = 0;
                                          req.owner_id.field_2._M_local_buf[0] = '\0';
                                          req.resource_owner_account._M_string_length = 0;
                                          req.resource_owner_account.field_2._M_local_buf[0] = '\0';
                                          req.resource_owner_id._M_string_length = 0;
                                          req.resource_owner_id.field_2._M_local_buf[0] = '\0';
                                          req.scaling_group_id._M_string_length = 0;
                                          req.scaling_group_id.field_2._M_local_buf[0] = '\0';
                                          req.instance_id1._M_dataplus._M_p =
                                               (pointer)&req.instance_id1.field_2;
                                          req.instance_id1._M_string_length = 0;
                                          req.instance_id1.field_2._M_local_buf[0] = '\0';
                                          req.instance_id2._M_dataplus._M_p =
                                               (pointer)&req.instance_id2.field_2;
                                          req.instance_id2._M_string_length = 0;
                                          req.instance_id2.field_2._M_local_buf[0] = '\0';
                                          req.instance_id3._M_dataplus._M_p =
                                               (pointer)&req.instance_id3.field_2;
                                          req.instance_id3._M_string_length = 0;
                                          req.instance_id3.field_2._M_local_buf[0] = '\0';
                                          req.instance_id4._M_dataplus._M_p =
                                               (pointer)&req.instance_id4.field_2;
                                          req.instance_id4._M_string_length = 0;
                                          req.instance_id4.field_2._M_local_buf[0] = '\0';
                                          req.instance_id5._M_dataplus._M_p =
                                               (pointer)&req.instance_id5.field_2;
                                          req.instance_id5._M_string_length = 0;
                                          req.instance_id5.field_2._M_local_buf[0] = '\0';
                                          req.owner_id._M_dataplus._M_p = (pointer)paVar1;
                                          req.resource_owner_account._M_dataplus._M_p =
                                               (pointer)paVar2;
                                          req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3;
                                          req.scaling_group_id._M_dataplus._M_p = (pointer)paVar4;
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)&resp,"cn-hangzhou",
                                                     (allocator<char> *)&local_8d8);
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    (local_8f8,"my_appid",
                                                     (allocator<char> *)&local_958);
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    (local_918,"my_secret",&local_959);
                                          this = (EssDescribeScheduledTasksRequestType *)
                                                 aliyun::Ess::CreateEssClient
                                                           (&resp,local_8f8,local_918);
                                          std::__cxx11::string::~string(local_918);
                                          std::__cxx11::string::~string(local_8f8);
                                          std::__cxx11::string::~string((string *)&resp);
                                          if (this == (EssDescribeScheduledTasksRequestType *)0x0) {
                                            aliyun::EssModifyScalingRuleRequestType::
                                            ~EssModifyScalingRuleRequestType
                                                      ((EssModifyScalingRuleRequestType *)&req);
                                            req.owner_id._M_string_length = 0;
                                            req.owner_id.field_2._M_local_buf[0] = '\0';
                                            req.resource_owner_account._M_string_length = 0;
                                            req.resource_owner_account.field_2._M_local_buf[0] =
                                                 '\0';
                                            req.resource_owner_id._M_string_length = 0;
                                            req.resource_owner_id.field_2._M_local_buf[0] = '\0';
                                            req.scaling_group_id._M_string_length = 0;
                                            req.scaling_group_id.field_2._M_local_buf[0] = '\0';
                                            req.instance_id1._M_dataplus._M_p =
                                                 (pointer)&req.instance_id1.field_2;
                                            req.instance_id1._M_string_length = 0;
                                            req.instance_id1.field_2._M_local_buf[0] = '\0';
                                            req.instance_id2._M_dataplus._M_p =
                                                 (pointer)&req.instance_id2.field_2;
                                            req.instance_id2._M_string_length = 0;
                                            req.instance_id2.field_2._M_local_buf[0] = '\0';
                                            req.instance_id3._M_dataplus._M_p =
                                                 (pointer)&req.instance_id3.field_2;
                                            req.instance_id3._M_string_length = 0;
                                            req.instance_id3.field_2._M_local_buf[0] = '\0';
                                            req.instance_id4._M_dataplus._M_p =
                                                 (pointer)&req.instance_id4.field_2;
                                            req.instance_id4._M_string_length = 0;
                                            req.instance_id4.field_2._M_local_buf[0] = '\0';
                                            req.instance_id5._M_dataplus._M_p =
                                                 (pointer)&req.instance_id5.field_2;
                                            req.instance_id5._M_string_length = 0;
                                            req.instance_id5.field_2._M_local_buf[0] = '\0';
                                            req.instance_id6._M_dataplus._M_p =
                                                 (pointer)&req.instance_id6.field_2;
                                            req.instance_id6._M_string_length = 0;
                                            req.instance_id6.field_2._M_local_buf[0] = '\0';
                                            req.instance_id7._M_dataplus._M_p =
                                                 (pointer)&req.instance_id7.field_2;
                                            req.instance_id7._M_string_length = 0;
                                            req.instance_id7.field_2._M_local_buf[0] = '\0';
                                            req.instance_id8._M_dataplus._M_p =
                                                 (pointer)&req.instance_id8.field_2;
                                            req.instance_id8._M_string_length = 0;
                                            req.instance_id8.field_2._M_local_buf[0] = '\0';
                                            req.instance_id9._M_dataplus._M_p =
                                                 (pointer)&req.instance_id9.field_2;
                                            req.instance_id9._M_string_length = 0;
                                            req.instance_id9.field_2._M_local_buf[0] = '\0';
                                            req.instance_id10._M_dataplus._M_p =
                                                 (pointer)&req.instance_id10.field_2;
                                            req.instance_id10._M_string_length = 0;
                                            req.instance_id10.field_2._M_local_buf[0] = '\0';
                                            req.owner_id._M_dataplus._M_p = (pointer)paVar1;
                                            req.resource_owner_account._M_dataplus._M_p =
                                                 (pointer)paVar2;
                                            req.resource_owner_id._M_dataplus._M_p = (pointer)paVar3
                                            ;
                                            req.scaling_group_id._M_dataplus._M_p = (pointer)paVar4;
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      ((string *)&resp,"cn-hangzhou",
                                                       (allocator<char> *)&local_8d8);
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      (local_8f8,"my_appid",
                                                       (allocator<char> *)&local_958);
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      (local_918,"my_secret",&local_959);
                                            this = (EssDescribeScheduledTasksRequestType *)
                                                   aliyun::Ess::CreateEssClient
                                                             (&resp,local_8f8,local_918);
                                            std::__cxx11::string::~string(local_918);
                                            std::__cxx11::string::~string(local_8f8);
                                            std::__cxx11::string::~string((string *)&resp);
                                            if (this == (EssDescribeScheduledTasksRequestType *)0x0)
                                            {
                                              aliyun::EssModifyScheduledTaskRequestType::
                                              ~EssModifyScheduledTaskRequestType
                                                        ((EssModifyScheduledTaskRequestType *)&req);
                                              req.owner_id._M_string_length = 0;
                                              req.owner_id.field_2._M_local_buf[0] = '\0';
                                              req.resource_owner_account._M_string_length = 0;
                                              req.resource_owner_account.field_2._M_local_buf[0] =
                                                   '\0';
                                              req.resource_owner_id._M_string_length = 0;
                                              req.resource_owner_id.field_2._M_local_buf[0] = '\0';
                                              req.scaling_group_id._M_string_length = 0;
                                              req.scaling_group_id.field_2._M_local_buf[0] = '\0';
                                              req.instance_id1._M_dataplus._M_p =
                                                   (pointer)&req.instance_id1.field_2;
                                              req.instance_id1._M_string_length = 0;
                                              req.instance_id1.field_2._M_local_buf[0] = '\0';
                                              req.instance_id2._M_dataplus._M_p =
                                                   (pointer)&req.instance_id2.field_2;
                                              req.instance_id2._M_string_length = 0;
                                              req.instance_id2.field_2._M_local_buf[0] = '\0';
                                              req.instance_id3._M_dataplus._M_p =
                                                   (pointer)&req.instance_id3.field_2;
                                              req.instance_id3._M_string_length = 0;
                                              req.instance_id3.field_2._M_local_buf[0] = '\0';
                                              req.instance_id4._M_dataplus._M_p =
                                                   (pointer)&req.instance_id4.field_2;
                                              req.instance_id4._M_string_length = 0;
                                              req.instance_id4.field_2._M_local_buf[0] = '\0';
                                              req.instance_id5._M_dataplus._M_p =
                                                   (pointer)&req.instance_id5.field_2;
                                              req.instance_id5._M_string_length = 0;
                                              req.instance_id5.field_2._M_local_buf[0] = '\0';
                                              req.instance_id6._M_dataplus._M_p =
                                                   (pointer)&req.instance_id6.field_2;
                                              req.instance_id6._M_string_length = 0;
                                              req.instance_id6.field_2._M_local_buf[0] = '\0';
                                              req.instance_id7._M_dataplus._M_p =
                                                   (pointer)&req.instance_id7.field_2;
                                              req.instance_id7._M_string_length = 0;
                                              req.instance_id7.field_2._M_local_buf[0] = '\0';
                                              req.instance_id8._M_dataplus._M_p =
                                                   (pointer)&req.instance_id8.field_2;
                                              req.instance_id8._M_string_length = 0;
                                              req.instance_id8.field_2._M_local_buf[0] = '\0';
                                              req.instance_id9._M_dataplus._M_p =
                                                   (pointer)&req.instance_id9.field_2;
                                              req.instance_id9._M_string_length = 0;
                                              req.instance_id9.field_2._M_local_buf[0] = '\0';
                                              req.instance_id10._M_dataplus._M_p =
                                                   (pointer)&req.instance_id10.field_2;
                                              req.instance_id10._M_string_length = 0;
                                              req.instance_id10.field_2._M_local_buf[0] = '\0';
                                              req.instance_id11._M_dataplus._M_p =
                                                   (pointer)&req.instance_id11.field_2;
                                              req.instance_id11._M_string_length = 0;
                                              req.instance_id11.field_2._M_local_buf[0] = '\0';
                                              req.instance_id12._M_dataplus._M_p =
                                                   (pointer)&req.instance_id12.field_2;
                                              req.instance_id12._M_string_length = 0;
                                              req.instance_id12.field_2._M_local_buf[0] = '\0';
                                              req.instance_id13._M_dataplus._M_p =
                                                   (pointer)&req.instance_id13.field_2;
                                              req.instance_id13._M_string_length = 0;
                                              req.instance_id13.field_2._M_local_buf[0] = '\0';
                                              req.instance_id14._M_dataplus._M_p =
                                                   (pointer)&req.instance_id14.field_2;
                                              req.instance_id14._M_string_length = 0;
                                              req.instance_id14.field_2._M_local_buf[0] = '\0';
                                              req.instance_id15._M_dataplus._M_p =
                                                   (pointer)&req.instance_id15.field_2;
                                              req.instance_id15._M_string_length = 0;
                                              req.instance_id15.field_2._M_local_buf[0] = '\0';
                                              req.instance_id16._M_dataplus._M_p =
                                                   (pointer)&req.instance_id16.field_2;
                                              req.instance_id16._M_string_length = 0;
                                              req.instance_id16.field_2._M_local_buf[0] = '\0';
                                              req.instance_id17._M_dataplus._M_p =
                                                   (pointer)&req.instance_id17.field_2;
                                              req.instance_id17._M_string_length = 0;
                                              req.instance_id17.field_2._M_local_buf[0] = '\0';
                                              req.instance_id18._M_dataplus._M_p =
                                                   (pointer)&req.instance_id18.field_2;
                                              req.instance_id18._M_string_length = 0;
                                              req.instance_id18.field_2._M_local_buf[0] = '\0';
                                              req.instance_id19._M_dataplus._M_p =
                                                   (pointer)&req.instance_id19.field_2;
                                              req.instance_id19._M_string_length = 0;
                                              req.instance_id19.field_2._M_local_buf[0] = '\0';
                                              req.instance_id20._M_dataplus._M_p =
                                                   (pointer)&req.instance_id20.field_2;
                                              req.instance_id20._M_string_length = 0;
                                              req.instance_id20.field_2._M_local_buf[0] = '\0';
                                              req.owner_account._M_dataplus._M_p =
                                                   (pointer)&req.owner_account.field_2;
                                              req.owner_account._M_string_length = 0;
                                              req.owner_account.field_2._M_local_buf[0] = '\0';
                                              resp.scaling_activity_id._M_dataplus._M_p =
                                                   (pointer)&resp.scaling_activity_id.field_2;
                                              resp.scaling_activity_id._M_string_length = 0;
                                              resp.scaling_activity_id.field_2._M_allocated_capacity
                                                   = resp.scaling_activity_id.field_2.
                                                     _M_allocated_capacity & 0xffffffffffffff00;
                                              req.owner_id._M_dataplus._M_p = (pointer)paVar1;
                                              req.resource_owner_account._M_dataplus._M_p =
                                                   (pointer)paVar2;
                                              req.resource_owner_id._M_dataplus._M_p =
                                                   (pointer)paVar3;
                                              req.scaling_group_id._M_dataplus._M_p =
                                                   (pointer)paVar4;
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        (local_8f8,"cn-hangzhou",
                                                         (allocator<char> *)&local_958);
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        (local_918,"my_appid",
                                                         (allocator<char> *)&resp_5);
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)&local_8d8,"my_secret",&local_959
                                                        );
                                              this = (EssDescribeScheduledTasksRequestType *)
                                                     aliyun::Ess::CreateEssClient
                                                               (local_8f8,local_918,&local_8d8);
                                              std::__cxx11::string::~string((string *)&local_8d8);
                                              std::__cxx11::string::~string(local_918);
                                              std::__cxx11::string::~string(local_8f8);
                                              if (this == (EssDescribeScheduledTasksRequestType *)
                                                          0x0) {
                                                std::__cxx11::string::~string((string *)&resp);
                                                aliyun::EssRemoveInstancesRequestType::
                                                ~EssRemoveInstancesRequestType
                                                          ((EssRemoveInstancesRequestType *)&req);
                                                return 0;
                                              }
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)&local_958,"127.0.0.1:12234",
                                                         (allocator<char> *)&resp_5);
                                              aliyun::Ess::SetProxyHost((Ess *)this,&local_958);
                                              std::__cxx11::string::~string((string *)&local_958);
                                              if ((char)(this->resource_owner_account).
                                                        _M_string_length == '\x01') {
                                                *(undefined1 *)
                                                 ((long)&(this->resource_owner_account).
                                                         _M_string_length + 1) = 0;
                                              }
                                              this_00 = (HttpTestListener *)operator_new(0x180);
                                              HttpTestListener::HttpTestListener(this_00,0x2fca);
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)&resp_5,
                                                                                                                  
                                                  "{  \"ScalingActivityId\": \"ScalingActivityId\"}"
                                                  ,&local_959);
                                              HttpTestListener::SetResponseBody
                                                        (this_00,(string *)&resp_5);
                                              std::__cxx11::string::~string((string *)&resp_5);
                                              HttpTestListener::Start(this_00);
                                              std::__cxx11::string::assign((char *)&req);
                                              std::__cxx11::string::assign
                                                        ((char *)&req.resource_owner_account);
                                              std::__cxx11::string::assign
                                                        ((char *)&req.resource_owner_id);
                                              std::__cxx11::string::assign
                                                        ((char *)&req.scaling_group_id);
                                              std::__cxx11::string::assign
                                                        ((char *)&req.instance_id1);
                                              std::__cxx11::string::assign
                                                        ((char *)&req.instance_id2);
                                              std::__cxx11::string::assign
                                                        ((char *)&req.instance_id3);
                                              std::__cxx11::string::assign
                                                        ((char *)&req.instance_id4);
                                              std::__cxx11::string::assign
                                                        ((char *)&req.instance_id5);
                                              std::__cxx11::string::assign
                                                        ((char *)&req.instance_id6);
                                              std::__cxx11::string::assign
                                                        ((char *)&req.instance_id7);
                                              std::__cxx11::string::assign
                                                        ((char *)&req.instance_id8);
                                              std::__cxx11::string::assign
                                                        ((char *)&req.instance_id9);
                                              std::__cxx11::string::assign
                                                        ((char *)&req.instance_id10);
                                              std::__cxx11::string::assign
                                                        ((char *)&req.instance_id11);
                                              std::__cxx11::string::assign
                                                        ((char *)&req.instance_id12);
                                              std::__cxx11::string::assign
                                                        ((char *)&req.instance_id13);
                                              std::__cxx11::string::assign
                                                        ((char *)&req.instance_id14);
                                              std::__cxx11::string::assign
                                                        ((char *)&req.instance_id15);
                                              std::__cxx11::string::assign
                                                        ((char *)&req.instance_id16);
                                              std::__cxx11::string::assign
                                                        ((char *)&req.instance_id17);
                                              std::__cxx11::string::assign
                                                        ((char *)&req.instance_id18);
                                              std::__cxx11::string::assign
                                                        ((char *)&req.instance_id19);
                                              std::__cxx11::string::assign
                                                        ((char *)&req.instance_id20);
                                              std::__cxx11::string::assign
                                                        ((char *)&req.owner_account);
                                              aliyun::Ess::RemoveInstances
                                                        ((EssRemoveInstancesRequestType *)this,
                                                         (EssRemoveInstancesResponseType *)&req,
                                                         (EssErrorInfo *)&resp);
                                              HttpTestListener::WaitComplete(this_00);
                                            }
                                            else {
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)&local_8d8,"127.0.0.1:12234",
                                                         (allocator<char> *)&local_958);
                                              aliyun::Ess::SetProxyHost((Ess *)this,&local_8d8);
                                              std::__cxx11::string::~string((string *)&local_8d8);
                                              if ((char)(this->resource_owner_account).
                                                        _M_string_length == '\x01') {
                                                *(undefined1 *)
                                                 ((long)&(this->resource_owner_account).
                                                         _M_string_length + 1) = 0;
                                              }
                                              this_00 = (HttpTestListener *)operator_new(0x180);
                                              HttpTestListener::HttpTestListener(this_00,0x2fca);
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)&local_958,"{}",&local_959);
                                              HttpTestListener::SetResponseBody(this_00,&local_958);
                                              std::__cxx11::string::~string((string *)&local_958);
                                              HttpTestListener::Start(this_00);
                                              std::__cxx11::string::assign((char *)&req);
                                              std::__cxx11::string::assign
                                                        ((char *)&req.resource_owner_account);
                                              std::__cxx11::string::assign
                                                        ((char *)&req.resource_owner_id);
                                              std::__cxx11::string::assign
                                                        ((char *)&req.scaling_group_id);
                                              std::__cxx11::string::assign
                                                        ((char *)&req.instance_id1);
                                              std::__cxx11::string::assign
                                                        ((char *)&req.instance_id2);
                                              std::__cxx11::string::assign
                                                        ((char *)&req.instance_id3);
                                              std::__cxx11::string::assign
                                                        ((char *)&req.instance_id4);
                                              std::__cxx11::string::assign
                                                        ((char *)&req.instance_id5);
                                              std::__cxx11::string::assign
                                                        ((char *)&req.instance_id6);
                                              std::__cxx11::string::assign
                                                        ((char *)&req.instance_id7);
                                              std::__cxx11::string::assign
                                                        ((char *)&req.instance_id8);
                                              std::__cxx11::string::assign
                                                        ((char *)&req.instance_id9);
                                              std::__cxx11::string::assign
                                                        ((char *)&req.instance_id10);
                                              aliyun::Ess::ModifyScheduledTask
                                                        ((EssModifyScheduledTaskRequestType *)this,
                                                         (EssModifyScheduledTaskResponseType *)&req,
                                                         (EssErrorInfo *)&resp_5);
                                              HttpTestListener::WaitComplete(this_00);
                                            }
                                          }
                                          else {
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      ((string *)&local_8d8,"127.0.0.1:12234",
                                                       (allocator<char> *)&local_958);
                                            aliyun::Ess::SetProxyHost((Ess *)this,&local_8d8);
                                            std::__cxx11::string::~string((string *)&local_8d8);
                                            if ((char)(this->resource_owner_account).
                                                      _M_string_length == '\x01') {
                                              *(undefined1 *)
                                               ((long)&(this->resource_owner_account).
                                                       _M_string_length + 1) = 0;
                                            }
                                            this_00 = (HttpTestListener *)operator_new(0x180);
                                            HttpTestListener::HttpTestListener(this_00,0x2fca);
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      ((string *)&local_958,"{}",&local_959);
                                            HttpTestListener::SetResponseBody(this_00,&local_958);
                                            std::__cxx11::string::~string((string *)&local_958);
                                            HttpTestListener::Start(this_00);
                                            std::__cxx11::string::assign((char *)&req);
                                            std::__cxx11::string::assign
                                                      ((char *)&req.resource_owner_account);
                                            std::__cxx11::string::assign
                                                      ((char *)&req.resource_owner_id);
                                            std::__cxx11::string::assign
                                                      ((char *)&req.scaling_group_id);
                                            std::__cxx11::string::assign((char *)&req.instance_id1);
                                            std::__cxx11::string::assign((char *)&req.instance_id2);
                                            std::__cxx11::string::assign((char *)&req.instance_id3);
                                            std::__cxx11::string::assign((char *)&req.instance_id4);
                                            std::__cxx11::string::assign((char *)&req.instance_id5);
                                            aliyun::Ess::ModifyScalingRule
                                                      ((EssModifyScalingRuleRequestType *)this,
                                                       (EssModifyScalingRuleResponseType *)&req,
                                                       (EssErrorInfo *)&resp_5);
                                            HttpTestListener::WaitComplete(this_00);
                                          }
                                        }
                                        else {
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)&local_8d8,"127.0.0.1:12234",
                                                     (allocator<char> *)&local_958);
                                          aliyun::Ess::SetProxyHost((Ess *)this,&local_8d8);
                                          std::__cxx11::string::~string((string *)&local_8d8);
                                          if ((char)(this->resource_owner_account)._M_string_length
                                              == '\x01') {
                                            *(undefined1 *)
                                             ((long)&(this->resource_owner_account)._M_string_length
                                             + 1) = 0;
                                          }
                                          this_00 = (HttpTestListener *)operator_new(0x180);
                                          HttpTestListener::HttpTestListener(this_00,0x2fca);
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)&local_958,"{}",&local_959);
                                          HttpTestListener::SetResponseBody(this_00,&local_958);
                                          std::__cxx11::string::~string((string *)&local_958);
                                          HttpTestListener::Start(this_00);
                                          std::__cxx11::string::assign((char *)&req);
                                          std::__cxx11::string::assign
                                                    ((char *)&req.resource_owner_account);
                                          std::__cxx11::string::assign
                                                    ((char *)&req.resource_owner_id);
                                          std::__cxx11::string::assign
                                                    ((char *)&req.scaling_group_id);
                                          std::__cxx11::string::assign((char *)&req.instance_id1);
                                          std::__cxx11::string::assign((char *)&req.instance_id2);
                                          std::__cxx11::string::assign((char *)&req.instance_id3);
                                          std::__cxx11::string::assign((char *)&req.instance_id4);
                                          std::__cxx11::string::assign((char *)&req.instance_id5);
                                          std::__cxx11::string::assign((char *)&req.instance_id6);
                                          std::__cxx11::string::assign((char *)&req.instance_id7);
                                          std::__cxx11::string::assign((char *)&req.instance_id8);
                                          aliyun::Ess::ModifyScalingGroup
                                                    ((EssModifyScalingGroupRequestType *)this,
                                                     (EssModifyScalingGroupResponseType *)&req,
                                                     (EssErrorInfo *)&resp_5);
                                          HttpTestListener::WaitComplete(this_00);
                                        }
                                      }
                                      else {
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_958,"127.0.0.1:12234",
                                                   (allocator<char> *)&resp_5);
                                        aliyun::Ess::SetProxyHost((Ess *)this,&local_958);
                                        std::__cxx11::string::~string((string *)&local_958);
                                        if ((char)(this->resource_owner_account)._M_string_length ==
                                            '\x01') {
                                          *(undefined1 *)
                                           ((long)&(this->resource_owner_account)._M_string_length +
                                           1) = 0;
                                        }
                                        this_00 = (HttpTestListener *)operator_new(0x180);
                                        HttpTestListener::HttpTestListener(this_00,0x2fca);
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&resp_5,
                                                                                                      
                                                  "{  \"ScalingActivityId\": \"ScalingActivityId\"}"
                                                  ,&local_959);
                                        HttpTestListener::SetResponseBody(this_00,(string *)&resp_5)
                                        ;
                                        std::__cxx11::string::~string((string *)&resp_5);
                                        HttpTestListener::Start(this_00);
                                        std::__cxx11::string::assign((char *)&req);
                                        std::__cxx11::string::assign
                                                  ((char *)&req.resource_owner_account);
                                        std::__cxx11::string::assign((char *)&req.resource_owner_id)
                                        ;
                                        std::__cxx11::string::assign((char *)&req.scaling_group_id);
                                        std::__cxx11::string::assign((char *)&req.instance_id1);
                                        std::__cxx11::string::assign((char *)&req.instance_id2);
                                        aliyun::Ess::ExecuteScalingRule
                                                  ((EssExecuteScalingRuleRequestType *)this,
                                                   (EssExecuteScalingRuleResponseType *)&req,
                                                   (EssErrorInfo *)&resp);
                                        HttpTestListener::WaitComplete(this_00);
                                      }
                                    }
                                    else {
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)&local_8d8,"127.0.0.1:12234",
                                                 (allocator<char> *)&local_958);
                                      aliyun::Ess::SetProxyHost((Ess *)this,&local_8d8);
                                      std::__cxx11::string::~string((string *)&local_8d8);
                                      if ((char)(this->resource_owner_account)._M_string_length ==
                                          '\x01') {
                                        *(undefined1 *)
                                         ((long)&(this->resource_owner_account)._M_string_length + 1
                                         ) = 0;
                                      }
                                      this_00 = (HttpTestListener *)operator_new(0x180);
                                      HttpTestListener::HttpTestListener(this_00,0x2fca);
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)&local_958,"{}",&local_959);
                                      HttpTestListener::SetResponseBody(this_00,&local_958);
                                      std::__cxx11::string::~string((string *)&local_958);
                                      HttpTestListener::Start(this_00);
                                      std::__cxx11::string::assign((char *)&req);
                                      std::__cxx11::string::assign
                                                ((char *)&req.resource_owner_account);
                                      std::__cxx11::string::assign((char *)&req.resource_owner_id);
                                      std::__cxx11::string::assign((char *)&req.scaling_group_id);
                                      std::__cxx11::string::assign((char *)&req.instance_id1);
                                      std::__cxx11::string::assign((char *)&req.instance_id2);
                                      std::__cxx11::string::assign((char *)&req.instance_id3);
                                      std::__cxx11::string::assign((char *)&req.instance_id4);
                                      std::__cxx11::string::assign((char *)&req.instance_id5);
                                      std::__cxx11::string::assign((char *)&req.instance_id6);
                                      std::__cxx11::string::assign((char *)&req.instance_id7);
                                      std::__cxx11::string::assign((char *)&req.instance_id8);
                                      std::__cxx11::string::assign((char *)&req.instance_id9);
                                      std::__cxx11::string::assign((char *)&req.instance_id10);
                                      std::__cxx11::string::assign((char *)&req.instance_id11);
                                      std::__cxx11::string::assign((char *)&req.instance_id12);
                                      std::__cxx11::string::assign((char *)&req.instance_id13);
                                      std::__cxx11::string::assign((char *)&req.instance_id14);
                                      std::__cxx11::string::assign((char *)&req.instance_id15);
                                      std::__cxx11::string::assign((char *)&req.instance_id16);
                                      std::__cxx11::string::assign((char *)&req.instance_id17);
                                      std::__cxx11::string::assign((char *)&req.instance_id18);
                                      std::__cxx11::string::assign((char *)&req.instance_id19);
                                      std::__cxx11::string::assign((char *)&req.instance_id20);
                                      std::__cxx11::string::assign((char *)&req.owner_account);
                                      std::__cxx11::string::assign((char *)&local_550);
                                      aliyun::Ess::EnableScalingGroup
                                                ((EssEnableScalingGroupRequestType *)this,
                                                 (EssEnableScalingGroupResponseType *)&req,
                                                 (EssErrorInfo *)&resp_5);
                                      HttpTestListener::WaitComplete(this_00);
                                    }
                                  }
                                  else {
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&local_8d8,"127.0.0.1:12234",
                                               (allocator<char> *)&local_958);
                                    aliyun::Ess::SetProxyHost((Ess *)this,&local_8d8);
                                    std::__cxx11::string::~string((string *)&local_8d8);
                                    if ((char)(this->resource_owner_account)._M_string_length ==
                                        '\x01') {
                                      *(undefined1 *)
                                       ((long)&(this->resource_owner_account)._M_string_length + 1)
                                           = 0;
                                    }
                                    this_00 = (HttpTestListener *)operator_new(0x180);
                                    HttpTestListener::HttpTestListener(this_00,0x2fca);
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&local_958,"{}",&local_959);
                                    HttpTestListener::SetResponseBody(this_00,&local_958);
                                    std::__cxx11::string::~string((string *)&local_958);
                                    HttpTestListener::Start(this_00);
                                    std::__cxx11::string::assign((char *)&req);
                                    std::__cxx11::string::assign
                                              ((char *)&req.resource_owner_account);
                                    std::__cxx11::string::assign((char *)&req.resource_owner_id);
                                    std::__cxx11::string::assign((char *)&req.scaling_group_id);
                                    std::__cxx11::string::assign((char *)&req.instance_id1);
                                    aliyun::Ess::DisableScalingGroup
                                              ((EssDisableScalingGroupRequestType *)this,
                                               (EssDisableScalingGroupResponseType *)&req,
                                               (EssErrorInfo *)&resp_5);
                                    HttpTestListener::WaitComplete(this_00);
                                  }
                                }
                                else {
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&local_958,"127.0.0.1:12234",
                                             (allocator<char> *)&resp_5);
                                  aliyun::Ess::SetProxyHost((Ess *)this,&local_958);
                                  std::__cxx11::string::~string((string *)&local_958);
                                  if ((char)(this->resource_owner_account)._M_string_length ==
                                      '\x01') {
                                    *(undefined1 *)
                                     ((long)&(this->resource_owner_account)._M_string_length + 1) =
                                         0;
                                  }
                                  this_00 = (HttpTestListener *)operator_new(0x180);
                                  HttpTestListener::HttpTestListener(this_00,0x2fca);
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&resp_5,
                                             "{  \"ScalingActivityId\": \"ScalingActivityId\"}",
                                             &local_959);
                                  HttpTestListener::SetResponseBody(this_00,(string *)&resp_5);
                                  std::__cxx11::string::~string((string *)&resp_5);
                                  HttpTestListener::Start(this_00);
                                  std::__cxx11::string::assign((char *)&req);
                                  std::__cxx11::string::assign((char *)&req.resource_owner_account);
                                  std::__cxx11::string::assign((char *)&req.resource_owner_id);
                                  std::__cxx11::string::assign((char *)&req.scaling_group_id);
                                  std::__cxx11::string::assign((char *)&req.instance_id1);
                                  std::__cxx11::string::assign((char *)&req.instance_id2);
                                  std::__cxx11::string::assign((char *)&req.instance_id3);
                                  std::__cxx11::string::assign((char *)&req.instance_id4);
                                  std::__cxx11::string::assign((char *)&req.instance_id5);
                                  std::__cxx11::string::assign((char *)&req.instance_id6);
                                  std::__cxx11::string::assign((char *)&req.instance_id7);
                                  std::__cxx11::string::assign((char *)&req.instance_id8);
                                  std::__cxx11::string::assign((char *)&req.instance_id9);
                                  std::__cxx11::string::assign((char *)&req.instance_id10);
                                  std::__cxx11::string::assign((char *)&req.instance_id11);
                                  std::__cxx11::string::assign((char *)&req.instance_id12);
                                  std::__cxx11::string::assign((char *)&req.instance_id13);
                                  std::__cxx11::string::assign((char *)&req.instance_id14);
                                  std::__cxx11::string::assign((char *)&req.instance_id15);
                                  std::__cxx11::string::assign((char *)&req.instance_id16);
                                  std::__cxx11::string::assign((char *)&req.instance_id17);
                                  std::__cxx11::string::assign((char *)&req.instance_id18);
                                  std::__cxx11::string::assign((char *)&req.instance_id19);
                                  std::__cxx11::string::assign((char *)&req.instance_id20);
                                  std::__cxx11::string::assign((char *)&req.owner_account);
                                  aliyun::Ess::DetachInstances
                                            ((EssDetachInstancesRequestType *)this,
                                             (EssDetachInstancesResponseType *)&req,
                                             (EssErrorInfo *)&resp);
                                  HttpTestListener::WaitComplete(this_00);
                                }
                              }
                              else {
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_958,"127.0.0.1:12234",
                                           (allocator<char> *)&resp_5);
                                aliyun::Ess::SetProxyHost((Ess *)this,&local_958);
                                std::__cxx11::string::~string((string *)&local_958);
                                if ((char)(this->resource_owner_account)._M_string_length == '\x01')
                                {
                                  *(undefined1 *)
                                   ((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
                                }
                                this_00 = (HttpTestListener *)operator_new(0x180);
                                HttpTestListener::HttpTestListener(this_00,0x2fca);
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&resp_5,
                                           "{  \"ScheduledTasks\": {    \"ScheduledTask\": [      {        \"ScheduledTaskId\": \"ScheduledTaskId\",        \"ScheduledTaskName\": \"ScheduledTaskName\",        \"Description\": \"Description\",        \"ScheduledAction\": \"ScheduledAction\",        \"RecurrenceEndTime\": \"RecurrenceEndTime\",        \"LaunchTime\": \"LaunchTime\",        \"RecurrenceType\": \"RecurrenceType\",        \"RecurrenceValue\": \"RecurrenceValue\",        \"LaunchExpirationTime\": 0,        \"TaskEnabled\": true      }    ]  },  \"TotalCount\": 0,  \"PageNumber\": 0,  \"PageSize\": 0}"
                                           ,&local_959);
                                HttpTestListener::SetResponseBody(this_00,(string *)&resp_5);
                                std::__cxx11::string::~string((string *)&resp_5);
                                HttpTestListener::Start(this_00);
                                std::__cxx11::string::assign((char *)&req);
                                std::__cxx11::string::assign((char *)&req.resource_owner_account);
                                std::__cxx11::string::assign((char *)&req.resource_owner_id);
                                std::__cxx11::string::assign((char *)&req.scaling_group_id);
                                std::__cxx11::string::assign((char *)&req.instance_id1);
                                std::__cxx11::string::assign((char *)&req.instance_id2);
                                std::__cxx11::string::assign((char *)&req.instance_id3);
                                std::__cxx11::string::assign((char *)&req.instance_id4);
                                std::__cxx11::string::assign((char *)&req.instance_id5);
                                std::__cxx11::string::assign((char *)&req.instance_id6);
                                std::__cxx11::string::assign((char *)&req.instance_id7);
                                std::__cxx11::string::assign((char *)&req.instance_id8);
                                std::__cxx11::string::assign((char *)&req.instance_id9);
                                std::__cxx11::string::assign((char *)&req.instance_id10);
                                std::__cxx11::string::assign((char *)&req.instance_id11);
                                std::__cxx11::string::assign((char *)&req.instance_id12);
                                std::__cxx11::string::assign((char *)&req.instance_id13);
                                std::__cxx11::string::assign((char *)&req.instance_id14);
                                std::__cxx11::string::assign((char *)&req.instance_id15);
                                std::__cxx11::string::assign((char *)&req.instance_id16);
                                std::__cxx11::string::assign((char *)&req.instance_id17);
                                std::__cxx11::string::assign((char *)&req.instance_id18);
                                std::__cxx11::string::assign((char *)&req.instance_id19);
                                std::__cxx11::string::assign((char *)&req.instance_id20);
                                std::__cxx11::string::assign((char *)&req.owner_account);
                                std::__cxx11::string::assign((char *)&local_550);
                                std::__cxx11::string::assign((char *)&local_530);
                                std::__cxx11::string::assign((char *)&local_510);
                                std::__cxx11::string::assign((char *)&local_4f0);
                                std::__cxx11::string::assign((char *)&local_4d0);
                                std::__cxx11::string::assign((char *)&local_4b0);
                                std::__cxx11::string::assign((char *)&local_490);
                                std::__cxx11::string::assign((char *)&local_470);
                                std::__cxx11::string::assign((char *)&local_450);
                                std::__cxx11::string::assign((char *)&local_430);
                                std::__cxx11::string::assign((char *)&local_410);
                                std::__cxx11::string::assign((char *)&local_3f0);
                                std::__cxx11::string::assign((char *)&local_3d0);
                                std::__cxx11::string::assign((char *)&local_3b0);
                                std::__cxx11::string::assign((char *)&local_390);
                                std::__cxx11::string::assign((char *)&local_370);
                                std::__cxx11::string::assign((char *)&local_350);
                                std::__cxx11::string::assign((char *)&local_330);
                                std::__cxx11::string::assign((char *)&local_310);
                                std::__cxx11::string::assign((char *)&local_2f0);
                                std::__cxx11::string::assign((char *)&local_2d0);
                                std::__cxx11::string::assign((char *)&local_2b0);
                                std::__cxx11::string::assign((char *)&local_290);
                                std::__cxx11::string::assign((char *)&local_270);
                                std::__cxx11::string::assign((char *)&local_250);
                                std::__cxx11::string::assign((char *)&local_230);
                                std::__cxx11::string::assign((char *)&local_210);
                                std::__cxx11::string::assign((char *)&local_1f0);
                                std::__cxx11::string::assign((char *)&local_1d0);
                                std::__cxx11::string::assign((char *)&local_1b0);
                                std::__cxx11::string::assign((char *)&local_190);
                                std::__cxx11::string::assign((char *)&local_170);
                                std::__cxx11::string::assign((char *)&local_150);
                                std::__cxx11::string::assign((char *)&local_130);
                                std::__cxx11::string::assign((char *)&local_110);
                                std::__cxx11::string::assign((char *)&local_f0);
                                std::__cxx11::string::assign((char *)&local_d0);
                                std::__cxx11::string::assign((char *)&local_b0);
                                std::__cxx11::string::assign((char *)&local_90);
                                std::__cxx11::string::assign((char *)&local_70);
                                std::__cxx11::string::assign((char *)&local_50);
                                aliyun::Ess::DescribeScheduledTasks
                                          (this,(EssDescribeScheduledTasksResponseType *)&req,
                                           (EssErrorInfo *)&resp);
                                HttpTestListener::WaitComplete(this_00);
                              }
                            }
                            else {
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_958,"127.0.0.1:12234",
                                         (allocator<char> *)&resp_5);
                              aliyun::Ess::SetProxyHost((Ess *)this,&local_958);
                              std::__cxx11::string::~string((string *)&local_958);
                              if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
                                *(undefined1 *)
                                 ((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
                              }
                              this_00 = (HttpTestListener *)operator_new(0x180);
                              HttpTestListener::HttpTestListener(this_00,0x2fca);
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&resp_5,
                                         "{  \"ScalingRules\": {    \"ScalingRule\": [      {        \"ScalingRuleId\": \"ScalingRuleId\",        \"ScalingGroupId\": \"ScalingGroupId\",        \"ScalingRuleName\": \"ScalingRuleName\",        \"Cooldown\": 0,        \"AdjustmentType\": \"AdjustmentType\",        \"AdjustmentValue\": 0,        \"MinSize\": 0,        \"MaxSize\": 0,        \"ScalingRuleAri\": \"ScalingRuleAri\"      }    ]  },  \"TotalCount\": 0,  \"PageNumber\": 0,  \"PageSize\": 0}"
                                         ,&local_959);
                              HttpTestListener::SetResponseBody(this_00,(string *)&resp_5);
                              std::__cxx11::string::~string((string *)&resp_5);
                              HttpTestListener::Start(this_00);
                              std::__cxx11::string::assign((char *)&req);
                              std::__cxx11::string::assign((char *)&req.resource_owner_account);
                              std::__cxx11::string::assign((char *)&req.resource_owner_id);
                              std::__cxx11::string::assign((char *)&req.scaling_group_id);
                              std::__cxx11::string::assign((char *)&req.instance_id1);
                              std::__cxx11::string::assign((char *)&req.instance_id2);
                              std::__cxx11::string::assign((char *)&req.instance_id3);
                              std::__cxx11::string::assign((char *)&req.instance_id4);
                              std::__cxx11::string::assign((char *)&req.instance_id5);
                              std::__cxx11::string::assign((char *)&req.instance_id6);
                              std::__cxx11::string::assign((char *)&req.instance_id7);
                              std::__cxx11::string::assign((char *)&req.instance_id8);
                              std::__cxx11::string::assign((char *)&req.instance_id9);
                              std::__cxx11::string::assign((char *)&req.instance_id10);
                              std::__cxx11::string::assign((char *)&req.instance_id11);
                              std::__cxx11::string::assign((char *)&req.instance_id12);
                              std::__cxx11::string::assign((char *)&req.instance_id13);
                              std::__cxx11::string::assign((char *)&req.instance_id14);
                              std::__cxx11::string::assign((char *)&req.instance_id15);
                              std::__cxx11::string::assign((char *)&req.instance_id16);
                              std::__cxx11::string::assign((char *)&req.instance_id17);
                              std::__cxx11::string::assign((char *)&req.instance_id18);
                              std::__cxx11::string::assign((char *)&req.instance_id19);
                              std::__cxx11::string::assign((char *)&req.instance_id20);
                              std::__cxx11::string::assign((char *)&req.owner_account);
                              std::__cxx11::string::assign((char *)&local_550);
                              std::__cxx11::string::assign((char *)&local_530);
                              std::__cxx11::string::assign((char *)&local_510);
                              std::__cxx11::string::assign((char *)&local_4f0);
                              std::__cxx11::string::assign((char *)&local_4d0);
                              std::__cxx11::string::assign((char *)&local_4b0);
                              std::__cxx11::string::assign((char *)&local_490);
                              std::__cxx11::string::assign((char *)&local_470);
                              std::__cxx11::string::assign((char *)&local_450);
                              std::__cxx11::string::assign((char *)&local_430);
                              std::__cxx11::string::assign((char *)&local_410);
                              std::__cxx11::string::assign((char *)&local_3f0);
                              aliyun::Ess::DescribeScalingRules
                                        ((EssDescribeScalingRulesRequestType *)this,
                                         (EssDescribeScalingRulesResponseType *)&req,
                                         (EssErrorInfo *)&resp);
                              HttpTestListener::WaitComplete(this_00);
                            }
                          }
                          else {
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_958,"127.0.0.1:12234",
                                       (allocator<char> *)&resp_5);
                            aliyun::Ess::SetProxyHost((Ess *)this,&local_958);
                            std::__cxx11::string::~string((string *)&local_958);
                            if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
                              *(undefined1 *)
                               ((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
                            }
                            this_00 = (HttpTestListener *)operator_new(0x180);
                            HttpTestListener::HttpTestListener(this_00,0x2fca);
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&resp_5,
                                       "{  \"ScalingInstances\": {    \"ScalingInstance\": [      {        \"InstanceId\": \"InstanceId\",        \"ScalingConfigurationId\": \"ScalingConfigurationId\",        \"ScalingGroupId\": \"ScalingGroupId\",        \"HealthStatus\": \"HealthStatus\",        \"LifecycleState\": \"LifecycleState\",        \"CreationTime\": \"CreationTime\",        \"CreationType\": \"CreationType\"      }    ]  },  \"TotalCount\": 0,  \"PageNumber\": 0,  \"PageSize\": 0}"
                                       ,&local_959);
                            HttpTestListener::SetResponseBody(this_00,(string *)&resp_5);
                            std::__cxx11::string::~string((string *)&resp_5);
                            HttpTestListener::Start(this_00);
                            std::__cxx11::string::assign((char *)&req);
                            std::__cxx11::string::assign((char *)&req.resource_owner_account);
                            std::__cxx11::string::assign((char *)&req.resource_owner_id);
                            std::__cxx11::string::assign((char *)&req.scaling_group_id);
                            std::__cxx11::string::assign((char *)&req.instance_id1);
                            std::__cxx11::string::assign((char *)&req.instance_id2);
                            std::__cxx11::string::assign((char *)&req.instance_id3);
                            std::__cxx11::string::assign((char *)&req.instance_id4);
                            std::__cxx11::string::assign((char *)&req.instance_id5);
                            std::__cxx11::string::assign((char *)&req.instance_id6);
                            std::__cxx11::string::assign((char *)&req.instance_id7);
                            std::__cxx11::string::assign((char *)&req.instance_id8);
                            std::__cxx11::string::assign((char *)&req.instance_id9);
                            std::__cxx11::string::assign((char *)&req.instance_id10);
                            std::__cxx11::string::assign((char *)&req.instance_id11);
                            std::__cxx11::string::assign((char *)&req.instance_id12);
                            std::__cxx11::string::assign((char *)&req.instance_id13);
                            std::__cxx11::string::assign((char *)&req.instance_id14);
                            std::__cxx11::string::assign((char *)&req.instance_id15);
                            std::__cxx11::string::assign((char *)&req.instance_id16);
                            std::__cxx11::string::assign((char *)&req.instance_id17);
                            std::__cxx11::string::assign((char *)&req.instance_id18);
                            std::__cxx11::string::assign((char *)&req.instance_id19);
                            std::__cxx11::string::assign((char *)&req.instance_id20);
                            std::__cxx11::string::assign((char *)&req.owner_account);
                            std::__cxx11::string::assign((char *)&local_550);
                            std::__cxx11::string::assign((char *)&local_530);
                            std::__cxx11::string::assign((char *)&local_510);
                            std::__cxx11::string::assign((char *)&local_4f0);
                            std::__cxx11::string::assign((char *)&local_4d0);
                            std::__cxx11::string::assign((char *)&local_4b0);
                            aliyun::Ess::DescribeScalingInstances
                                      ((EssDescribeScalingInstancesRequestType *)this,
                                       (EssDescribeScalingInstancesResponseType *)&req,
                                       (EssErrorInfo *)&resp);
                            HttpTestListener::WaitComplete(this_00);
                          }
                        }
                        else {
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_958,"127.0.0.1:12234",
                                     (allocator<char> *)&resp_5);
                          aliyun::Ess::SetProxyHost((Ess *)this,&local_958);
                          std::__cxx11::string::~string((string *)&local_958);
                          if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
                            *(undefined1 *)
                             ((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
                          }
                          this_00 = (HttpTestListener *)operator_new(0x180);
                          HttpTestListener::HttpTestListener(this_00,0x2fca);
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&resp_5,
                                     "{  \"ScalingGroups\": {    \"ScalingGroup\": [      {        \"RemovalPolicies\": {          \"RemovalPolicy\": [            \"RemovalPolicy\"          ]        },        \"DBInstanceIds\": {          \"DBInstanceId\": [            \"DBInstanceId\"          ]        },        \"DefaultCooldown\": 0,        \"MaxSize\": 0,        \"PendingCapacity\": 0,        \"LoadBalancerId\": \"LoadBalancerId\",        \"RemovingCapacity\": 0,        \"ScalingGroupName\": \"ScalingGroupName\",        \"ActiveCapacity\": 0,        \"ActiveScalingConfigurationId\": \"ActiveScalingConfigurationId\",        \"ScalingGroupId\": \"ScalingGroupId\",        \"RegionId\": \"RegionId\",        \"TotalCapacity\": 0,        \"MinSize\": 0,        \"LifecycleState\": \"LifecycleState\",        \"CreationTime\": \"CreationTime\"      }    ]  },  \"TotalCount\": 0,  \"PageNumber\": 0,  \"PageSize\": 0}"
                                     ,&local_959);
                          HttpTestListener::SetResponseBody(this_00,(string *)&resp_5);
                          std::__cxx11::string::~string((string *)&resp_5);
                          HttpTestListener::Start(this_00);
                          std::__cxx11::string::assign((char *)&req);
                          std::__cxx11::string::assign((char *)&req.resource_owner_account);
                          std::__cxx11::string::assign((char *)&req.resource_owner_id);
                          std::__cxx11::string::assign((char *)&req.scaling_group_id);
                          std::__cxx11::string::assign((char *)&req.instance_id1);
                          std::__cxx11::string::assign((char *)&req.instance_id2);
                          std::__cxx11::string::assign((char *)&req.instance_id3);
                          std::__cxx11::string::assign((char *)&req.instance_id4);
                          std::__cxx11::string::assign((char *)&req.instance_id5);
                          std::__cxx11::string::assign((char *)&req.instance_id6);
                          std::__cxx11::string::assign((char *)&req.instance_id7);
                          std::__cxx11::string::assign((char *)&req.instance_id8);
                          std::__cxx11::string::assign((char *)&req.instance_id9);
                          std::__cxx11::string::assign((char *)&req.instance_id10);
                          std::__cxx11::string::assign((char *)&req.instance_id11);
                          std::__cxx11::string::assign((char *)&req.instance_id12);
                          std::__cxx11::string::assign((char *)&req.instance_id13);
                          std::__cxx11::string::assign((char *)&req.instance_id14);
                          std::__cxx11::string::assign((char *)&req.instance_id15);
                          std::__cxx11::string::assign((char *)&req.instance_id16);
                          std::__cxx11::string::assign((char *)&req.instance_id17);
                          std::__cxx11::string::assign((char *)&req.instance_id18);
                          std::__cxx11::string::assign((char *)&req.instance_id19);
                          std::__cxx11::string::assign((char *)&req.instance_id20);
                          std::__cxx11::string::assign((char *)&req.owner_account);
                          std::__cxx11::string::assign((char *)&local_550);
                          std::__cxx11::string::assign((char *)&local_530);
                          std::__cxx11::string::assign((char *)&local_510);
                          std::__cxx11::string::assign((char *)&local_4f0);
                          std::__cxx11::string::assign((char *)&local_4d0);
                          std::__cxx11::string::assign((char *)&local_4b0);
                          std::__cxx11::string::assign((char *)&local_490);
                          std::__cxx11::string::assign((char *)&local_470);
                          std::__cxx11::string::assign((char *)&local_450);
                          std::__cxx11::string::assign((char *)&local_430);
                          std::__cxx11::string::assign((char *)&local_410);
                          std::__cxx11::string::assign((char *)&local_3f0);
                          std::__cxx11::string::assign((char *)&local_3d0);
                          std::__cxx11::string::assign((char *)&local_3b0);
                          std::__cxx11::string::assign((char *)&local_390);
                          std::__cxx11::string::assign((char *)&local_370);
                          std::__cxx11::string::assign((char *)&local_350);
                          std::__cxx11::string::assign((char *)&local_330);
                          std::__cxx11::string::assign((char *)&local_310);
                          std::__cxx11::string::assign((char *)&local_2f0);
                          aliyun::Ess::DescribeScalingGroups
                                    ((EssDescribeScalingGroupsRequestType *)this,
                                     (EssDescribeScalingGroupsResponseType *)&req,
                                     (EssErrorInfo *)&resp);
                          HttpTestListener::WaitComplete(this_00);
                        }
                      }
                      else {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_958,"127.0.0.1:12234",(allocator<char> *)&resp_5
                                  );
                        aliyun::Ess::SetProxyHost((Ess *)this,&local_958);
                        std::__cxx11::string::~string((string *)&local_958);
                        if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
                          *(undefined1 *)
                           ((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
                        }
                        this_00 = (HttpTestListener *)operator_new(0x180);
                        HttpTestListener::HttpTestListener(this_00,0x2fca);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&resp_5,
                                   "{  \"ScalingConfigurations\": {    \"ScalingConfiguration\": [      {        \"DataDisks\": {          \"DataDisk\": [            {              \"Size\": 0,              \"Category\": \"Category\",              \"SnapshotId\": \"SnapshotId\",              \"Device\": \"Device\"            }          ]        },        \"ScalingConfigurationId\": \"ScalingConfigurationId\",        \"ScalingConfigurationName\": \"ScalingConfigurationName\",        \"ScalingGroupId\": \"ScalingGroupId\",        \"ImageId\": \"ImageId\",        \"InstanceType\": \"InstanceType\",        \"SecurityGroupId\": \"SecurityGroupId\",        \"InternetChargeType\": \"InternetChargeType\",        \"InternetMaxBandwidthIn\": 0,        \"InternetMaxBandwidthOut\": 0,        \"SystemDiskCategory\": \"SystemDiskCategory\",        \"LifecycleState\": \"LifecycleState\",        \"CreationTime\": \"CreationTime\"      }    ]  },  \"TotalCount\": 0,  \"PageNumber\": 0,  \"PageSize\": 0}"
                                   ,&local_959);
                        HttpTestListener::SetResponseBody(this_00,(string *)&resp_5);
                        std::__cxx11::string::~string((string *)&resp_5);
                        HttpTestListener::Start(this_00);
                        std::__cxx11::string::assign((char *)&req);
                        std::__cxx11::string::assign((char *)&req.resource_owner_account);
                        std::__cxx11::string::assign((char *)&req.resource_owner_id);
                        std::__cxx11::string::assign((char *)&req.scaling_group_id);
                        std::__cxx11::string::assign((char *)&req.instance_id1);
                        std::__cxx11::string::assign((char *)&req.instance_id2);
                        std::__cxx11::string::assign((char *)&req.instance_id3);
                        std::__cxx11::string::assign((char *)&req.instance_id4);
                        std::__cxx11::string::assign((char *)&req.instance_id5);
                        std::__cxx11::string::assign((char *)&req.instance_id6);
                        std::__cxx11::string::assign((char *)&req.instance_id7);
                        std::__cxx11::string::assign((char *)&req.instance_id8);
                        std::__cxx11::string::assign((char *)&req.instance_id9);
                        std::__cxx11::string::assign((char *)&req.instance_id10);
                        std::__cxx11::string::assign((char *)&req.instance_id11);
                        std::__cxx11::string::assign((char *)&req.instance_id12);
                        std::__cxx11::string::assign((char *)&req.instance_id13);
                        std::__cxx11::string::assign((char *)&req.instance_id14);
                        std::__cxx11::string::assign((char *)&req.instance_id15);
                        std::__cxx11::string::assign((char *)&req.instance_id16);
                        std::__cxx11::string::assign((char *)&req.instance_id17);
                        std::__cxx11::string::assign((char *)&req.instance_id18);
                        std::__cxx11::string::assign((char *)&req.instance_id19);
                        std::__cxx11::string::assign((char *)&req.instance_id20);
                        std::__cxx11::string::assign((char *)&req.owner_account);
                        std::__cxx11::string::assign((char *)&local_550);
                        std::__cxx11::string::assign((char *)&local_530);
                        aliyun::Ess::DescribeScalingConfigurations
                                  ((EssDescribeScalingConfigurationsRequestType *)this,
                                   (EssDescribeScalingConfigurationsResponseType *)&req,
                                   (EssErrorInfo *)&resp);
                        HttpTestListener::WaitComplete(this_00);
                      }
                    }
                    else {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_958,"127.0.0.1:12234",(allocator<char> *)&resp_5);
                      aliyun::Ess::SetProxyHost((Ess *)this,&local_958);
                      std::__cxx11::string::~string((string *)&local_958);
                      if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
                        *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1)
                             = 0;
                      }
                      this_00 = (HttpTestListener *)operator_new(0x180);
                      HttpTestListener::HttpTestListener(this_00,0x2fca);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&resp_5,
                                 "{  \"ScalingActivities\": {    \"ScalingActivity\": [      {        \"ScalingActivityId\": \"ScalingActivityId\",        \"ScalingGroupId\": \"ScalingGroupId\",        \"Description\": \"Description\",        \"Cause\": \"Cause\",        \"StartTime\": \"StartTime\",        \"EndTime\": \"EndTime\",        \"Progress\": 0,        \"StatusCode\": \"StatusCode\",        \"StatusMessage\": \"StatusMessage\"      }    ]  },  \"TotalCount\": 0,  \"PageNumber\": 0,  \"PageSize\": 0}"
                                 ,&local_959);
                      HttpTestListener::SetResponseBody(this_00,(string *)&resp_5);
                      std::__cxx11::string::~string((string *)&resp_5);
                      HttpTestListener::Start(this_00);
                      std::__cxx11::string::assign((char *)&req);
                      std::__cxx11::string::assign((char *)&req.resource_owner_account);
                      std::__cxx11::string::assign((char *)&req.resource_owner_id);
                      std::__cxx11::string::assign((char *)&req.scaling_group_id);
                      std::__cxx11::string::assign((char *)&req.instance_id1);
                      std::__cxx11::string::assign((char *)&req.instance_id2);
                      std::__cxx11::string::assign((char *)&req.instance_id3);
                      std::__cxx11::string::assign((char *)&req.instance_id4);
                      std::__cxx11::string::assign((char *)&req.instance_id5);
                      std::__cxx11::string::assign((char *)&req.instance_id6);
                      std::__cxx11::string::assign((char *)&req.instance_id7);
                      std::__cxx11::string::assign((char *)&req.instance_id8);
                      std::__cxx11::string::assign((char *)&req.instance_id9);
                      std::__cxx11::string::assign((char *)&req.instance_id10);
                      std::__cxx11::string::assign((char *)&req.instance_id11);
                      std::__cxx11::string::assign((char *)&req.instance_id12);
                      std::__cxx11::string::assign((char *)&req.instance_id13);
                      std::__cxx11::string::assign((char *)&req.instance_id14);
                      std::__cxx11::string::assign((char *)&req.instance_id15);
                      std::__cxx11::string::assign((char *)&req.instance_id16);
                      std::__cxx11::string::assign((char *)&req.instance_id17);
                      std::__cxx11::string::assign((char *)&req.instance_id18);
                      std::__cxx11::string::assign((char *)&req.instance_id19);
                      std::__cxx11::string::assign((char *)&req.instance_id20);
                      std::__cxx11::string::assign((char *)&req.owner_account);
                      std::__cxx11::string::assign((char *)&local_550);
                      std::__cxx11::string::assign((char *)&local_530);
                      std::__cxx11::string::assign((char *)&local_510);
                      aliyun::Ess::DescribeScalingActivities
                                ((EssDescribeScalingActivitiesRequestType *)this,
                                 (EssDescribeScalingActivitiesResponseType *)&req,
                                 (EssErrorInfo *)&resp);
                      HttpTestListener::WaitComplete(this_00);
                    }
                  }
                  else {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_8d8,"127.0.0.1:12234",(allocator<char> *)&local_958)
                    ;
                    aliyun::Ess::SetProxyHost((Ess *)this,&local_8d8);
                    std::__cxx11::string::~string((string *)&local_8d8);
                    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
                      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) =
                           0;
                    }
                    this_00 = (HttpTestListener *)operator_new(0x180);
                    HttpTestListener::HttpTestListener(this_00,0x2fca);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_958,"{}",&local_959);
                    HttpTestListener::SetResponseBody(this_00,&local_958);
                    std::__cxx11::string::~string((string *)&local_958);
                    HttpTestListener::Start(this_00);
                    std::__cxx11::string::assign((char *)&req);
                    std::__cxx11::string::assign((char *)&req.resource_owner_account);
                    std::__cxx11::string::assign((char *)&req.resource_owner_id);
                    std::__cxx11::string::assign((char *)&req.scaling_group_id);
                    std::__cxx11::string::assign((char *)&req.instance_id1);
                    aliyun::Ess::DeleteScheduledTask
                              ((EssDeleteScheduledTaskRequestType *)this,
                               (EssDeleteScheduledTaskResponseType *)&req,(EssErrorInfo *)&resp_5);
                    HttpTestListener::WaitComplete(this_00);
                  }
                }
                else {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_8d8,"127.0.0.1:12234",(allocator<char> *)&local_958);
                  aliyun::Ess::SetProxyHost((Ess *)this,&local_8d8);
                  std::__cxx11::string::~string((string *)&local_8d8);
                  if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
                    *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
                  }
                  this_00 = (HttpTestListener *)operator_new(0x180);
                  HttpTestListener::HttpTestListener(this_00,0x2fca);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_958,"{}",&local_959);
                  HttpTestListener::SetResponseBody(this_00,&local_958);
                  std::__cxx11::string::~string((string *)&local_958);
                  HttpTestListener::Start(this_00);
                  std::__cxx11::string::assign((char *)&req);
                  std::__cxx11::string::assign((char *)&req.resource_owner_account);
                  std::__cxx11::string::assign((char *)&req.resource_owner_id);
                  std::__cxx11::string::assign((char *)&req.scaling_group_id);
                  std::__cxx11::string::assign((char *)&req.instance_id1);
                  aliyun::Ess::DeleteScalingRule
                            ((EssDeleteScalingRuleRequestType *)this,
                             (EssDeleteScalingRuleResponseType *)&req,(EssErrorInfo *)&resp_5);
                  HttpTestListener::WaitComplete(this_00);
                }
              }
              else {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_8d8,"127.0.0.1:12234",(allocator<char> *)&local_958);
                aliyun::Ess::SetProxyHost((Ess *)this,&local_8d8);
                std::__cxx11::string::~string((string *)&local_8d8);
                if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
                  *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
                }
                this_00 = (HttpTestListener *)operator_new(0x180);
                HttpTestListener::HttpTestListener(this_00,0x2fca);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_958,"{}",&local_959);
                HttpTestListener::SetResponseBody(this_00,&local_958);
                std::__cxx11::string::~string((string *)&local_958);
                HttpTestListener::Start(this_00);
                std::__cxx11::string::assign((char *)&req);
                std::__cxx11::string::assign((char *)&req.resource_owner_account);
                std::__cxx11::string::assign((char *)&req.resource_owner_id);
                std::__cxx11::string::assign((char *)&req.scaling_group_id);
                std::__cxx11::string::assign((char *)&req.instance_id1);
                std::__cxx11::string::assign((char *)&req.instance_id2);
                aliyun::Ess::DeleteScalingGroup
                          ((EssDeleteScalingGroupRequestType *)this,
                           (EssDeleteScalingGroupResponseType *)&req,(EssErrorInfo *)&resp_5);
                HttpTestListener::WaitComplete(this_00);
              }
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_8d8,"127.0.0.1:12234",(allocator<char> *)&local_958);
              aliyun::Ess::SetProxyHost((Ess *)this,&local_8d8);
              std::__cxx11::string::~string((string *)&local_8d8);
              if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
                *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
              }
              this_00 = (HttpTestListener *)operator_new(0x180);
              HttpTestListener::HttpTestListener(this_00,0x2fca);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_958,"{}",&local_959);
              HttpTestListener::SetResponseBody(this_00,&local_958);
              std::__cxx11::string::~string((string *)&local_958);
              HttpTestListener::Start(this_00);
              std::__cxx11::string::assign((char *)&req);
              std::__cxx11::string::assign((char *)&req.resource_owner_account);
              std::__cxx11::string::assign((char *)&req.resource_owner_id);
              std::__cxx11::string::assign((char *)&req.scaling_group_id);
              std::__cxx11::string::assign((char *)&req.instance_id1);
              aliyun::Ess::DeleteScalingConfiguration
                        ((EssDeleteScalingConfigurationRequestType *)this,
                         (EssDeleteScalingConfigurationResponseType *)&req,(EssErrorInfo *)&resp_5);
              HttpTestListener::WaitComplete(this_00);
            }
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_958,"127.0.0.1:12234",(allocator<char> *)&resp_5);
            aliyun::Ess::SetProxyHost((Ess *)this,&local_958);
            std::__cxx11::string::~string((string *)&local_958);
            if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
              *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
            }
            this_00 = (HttpTestListener *)operator_new(0x180);
            HttpTestListener::HttpTestListener(this_00,0x2fca);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&resp_5,"{  \"ScheduledTaskId\": \"ScheduledTaskId\"}",&local_959);
            HttpTestListener::SetResponseBody(this_00,(string *)&resp_5);
            std::__cxx11::string::~string((string *)&resp_5);
            HttpTestListener::Start(this_00);
            std::__cxx11::string::assign((char *)&req);
            std::__cxx11::string::assign((char *)&req.resource_owner_account);
            std::__cxx11::string::assign((char *)&req.resource_owner_id);
            std::__cxx11::string::assign((char *)&req.scaling_group_id);
            std::__cxx11::string::assign((char *)&req.instance_id1);
            std::__cxx11::string::assign((char *)&req.instance_id2);
            std::__cxx11::string::assign((char *)&req.instance_id3);
            std::__cxx11::string::assign((char *)&req.instance_id4);
            std::__cxx11::string::assign((char *)&req.instance_id5);
            std::__cxx11::string::assign((char *)&req.instance_id6);
            std::__cxx11::string::assign((char *)&req.instance_id7);
            std::__cxx11::string::assign((char *)&req.instance_id8);
            std::__cxx11::string::assign((char *)&req.instance_id9);
            aliyun::Ess::CreateScheduledTask
                      ((EssCreateScheduledTaskRequestType *)this,
                       (EssCreateScheduledTaskResponseType *)&req,(EssErrorInfo *)&resp);
            HttpTestListener::WaitComplete(this_00);
          }
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_958,"127.0.0.1:12234",(allocator<char> *)&resp_5);
          aliyun::Ess::SetProxyHost((Ess *)this,&local_958);
          std::__cxx11::string::~string((string *)&local_958);
          if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
            *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
          }
          this_00 = (HttpTestListener *)operator_new(0x180);
          HttpTestListener::HttpTestListener(this_00,0x2fca);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&resp_5,
                     "{  \"ScalingRuleId\": \"ScalingRuleId\",  \"ScalingRuleAri\": \"ScalingRuleAri\"}"
                     ,&local_959);
          HttpTestListener::SetResponseBody(this_00,(string *)&resp_5);
          std::__cxx11::string::~string((string *)&resp_5);
          HttpTestListener::Start(this_00);
          std::__cxx11::string::assign((char *)&req);
          std::__cxx11::string::assign((char *)&req.resource_owner_account);
          std::__cxx11::string::assign((char *)&req.resource_owner_id);
          std::__cxx11::string::assign((char *)&req.scaling_group_id);
          std::__cxx11::string::assign((char *)&req.instance_id1);
          std::__cxx11::string::assign((char *)&req.instance_id2);
          std::__cxx11::string::assign((char *)&req.instance_id3);
          std::__cxx11::string::assign((char *)&req.instance_id4);
          std::__cxx11::string::assign((char *)&req.instance_id5);
          aliyun::Ess::CreateScalingRule
                    ((EssCreateScalingRuleRequestType *)this,
                     (EssCreateScalingRuleResponseType *)&req,(EssErrorInfo *)&resp);
          HttpTestListener::WaitComplete(this_00);
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_958,"127.0.0.1:12234",(allocator<char> *)&resp_5);
        aliyun::Ess::SetProxyHost((Ess *)this,&local_958);
        std::__cxx11::string::~string((string *)&local_958);
        if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
          *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
        }
        this_00 = (HttpTestListener *)operator_new(0x180);
        HttpTestListener::HttpTestListener(this_00,0x2fca);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&resp_5,"{  \"ScalingGroupId\": \"ScalingGroupId\"}",&local_959);
        HttpTestListener::SetResponseBody(this_00,(string *)&resp_5);
        std::__cxx11::string::~string((string *)&resp_5);
        HttpTestListener::Start(this_00);
        std::__cxx11::string::assign((char *)&req);
        std::__cxx11::string::assign((char *)&req.resource_owner_account);
        std::__cxx11::string::assign((char *)&req.resource_owner_id);
        std::__cxx11::string::assign((char *)&req.scaling_group_id);
        std::__cxx11::string::assign((char *)&req.instance_id1);
        std::__cxx11::string::assign((char *)&req.instance_id2);
        std::__cxx11::string::assign((char *)&req.instance_id3);
        std::__cxx11::string::assign((char *)&req.instance_id4);
        std::__cxx11::string::assign((char *)&req.instance_id5);
        std::__cxx11::string::assign((char *)&req.instance_id6);
        std::__cxx11::string::assign((char *)&req.instance_id7);
        std::__cxx11::string::assign((char *)&req.instance_id8);
        std::__cxx11::string::assign((char *)&req.instance_id9);
        std::__cxx11::string::assign((char *)&req.instance_id10);
        aliyun::Ess::CreateScalingGroup
                  ((EssCreateScalingGroupRequestType *)this,
                   (EssCreateScalingGroupResponseType *)&req,(EssErrorInfo *)&resp);
        HttpTestListener::WaitComplete(this_00);
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_958,"127.0.0.1:12234",(allocator<char> *)&resp_5);
      aliyun::Ess::SetProxyHost((Ess *)this,&local_958);
      std::__cxx11::string::~string((string *)&local_958);
      if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
        *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
      }
      this_00 = (HttpTestListener *)operator_new(0x180);
      HttpTestListener::HttpTestListener(this_00,0x2fca);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&resp_5,"{  \"ScalingConfigurationId\": \"ScalingConfigurationId\"}",
                 &local_959);
      HttpTestListener::SetResponseBody(this_00,(string *)&resp_5);
      std::__cxx11::string::~string((string *)&resp_5);
      HttpTestListener::Start(this_00);
      std::__cxx11::string::assign((char *)&req);
      std::__cxx11::string::assign((char *)&req.resource_owner_account);
      std::__cxx11::string::assign((char *)&req.resource_owner_id);
      std::__cxx11::string::assign((char *)&req.scaling_group_id);
      std::__cxx11::string::assign((char *)&req.instance_id1);
      std::__cxx11::string::assign((char *)&req.instance_id2);
      std::__cxx11::string::assign((char *)&req.instance_id3);
      std::__cxx11::string::assign((char *)&req.instance_id4);
      std::__cxx11::string::assign((char *)&req.instance_id5);
      std::__cxx11::string::assign((char *)&req.instance_id6);
      std::__cxx11::string::assign((char *)&req.instance_id7);
      std::__cxx11::string::assign((char *)&req.instance_id8);
      std::__cxx11::string::assign((char *)&req.instance_id9);
      std::__cxx11::string::assign((char *)&req.instance_id10);
      std::__cxx11::string::assign((char *)&req.instance_id11);
      std::__cxx11::string::assign((char *)&req.instance_id12);
      std::__cxx11::string::assign((char *)&req.instance_id13);
      std::__cxx11::string::assign((char *)&req.instance_id14);
      std::__cxx11::string::assign((char *)&req.instance_id15);
      std::__cxx11::string::assign((char *)&req.instance_id16);
      std::__cxx11::string::assign((char *)&req.instance_id17);
      std::__cxx11::string::assign((char *)&req.instance_id18);
      std::__cxx11::string::assign((char *)&req.instance_id19);
      std::__cxx11::string::assign((char *)&req.instance_id20);
      std::__cxx11::string::assign((char *)&req.owner_account);
      std::__cxx11::string::assign((char *)&local_550);
      std::__cxx11::string::assign((char *)&local_530);
      std::__cxx11::string::assign((char *)&local_510);
      std::__cxx11::string::assign((char *)&local_4f0);
      std::__cxx11::string::assign((char *)&local_4d0);
      std::__cxx11::string::assign((char *)&local_4b0);
      std::__cxx11::string::assign((char *)&local_490);
      std::__cxx11::string::assign((char *)&local_470);
      aliyun::Ess::CreateScalingConfiguration
                ((EssCreateScalingConfigurationRequestType *)this,
                 (EssCreateScalingConfigurationResponseType *)&req,(EssErrorInfo *)&resp);
      HttpTestListener::WaitComplete(this_00);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_958,"127.0.0.1:12234",(allocator<char> *)&resp_5);
    aliyun::Ess::SetProxyHost((Ess *)this,&local_958);
    std::__cxx11::string::~string((string *)&local_958);
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    this_00 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(this_00,0x2fca);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&resp_5,"{  \"ScalingActivityId\": \"ScalingActivityId\"}",&local_959);
    HttpTestListener::SetResponseBody(this_00,(string *)&resp_5);
    std::__cxx11::string::~string((string *)&resp_5);
    HttpTestListener::Start(this_00);
    std::__cxx11::string::assign((char *)&req);
    std::__cxx11::string::assign((char *)&req.resource_owner_account);
    std::__cxx11::string::assign((char *)&req.resource_owner_id);
    std::__cxx11::string::assign((char *)&req.scaling_group_id);
    std::__cxx11::string::assign((char *)&req.instance_id1);
    std::__cxx11::string::assign((char *)&req.instance_id2);
    std::__cxx11::string::assign((char *)&req.instance_id3);
    std::__cxx11::string::assign((char *)&req.instance_id4);
    std::__cxx11::string::assign((char *)&req.instance_id5);
    std::__cxx11::string::assign((char *)&req.instance_id6);
    std::__cxx11::string::assign((char *)&req.instance_id7);
    std::__cxx11::string::assign((char *)&req.instance_id8);
    std::__cxx11::string::assign((char *)&req.instance_id9);
    std::__cxx11::string::assign((char *)&req.instance_id10);
    std::__cxx11::string::assign((char *)&req.instance_id11);
    std::__cxx11::string::assign((char *)&req.instance_id12);
    std::__cxx11::string::assign((char *)&req.instance_id13);
    std::__cxx11::string::assign((char *)&req.instance_id14);
    std::__cxx11::string::assign((char *)&req.instance_id15);
    std::__cxx11::string::assign((char *)&req.instance_id16);
    std::__cxx11::string::assign((char *)&req.instance_id17);
    std::__cxx11::string::assign((char *)&req.instance_id18);
    std::__cxx11::string::assign((char *)&req.instance_id19);
    std::__cxx11::string::assign((char *)&req.instance_id20);
    std::__cxx11::string::assign((char *)&req.owner_account);
    aliyun::Ess::AttachInstances
              ((EssAttachInstancesRequestType *)this,(EssAttachInstancesResponseType *)&req,
               (EssErrorInfo *)&resp);
    HttpTestListener::WaitComplete(this_00);
  }
  HttpTestListener::~HttpTestListener(this_00);
  operator_delete(this_00,0x180);
  aliyun::Ess::~Ess((Ess *)this);
  operator_delete(this,0x38);
  std::
  vector<aliyun::EssDescribeScheduledTasksScheduledTaskType,_std::allocator<aliyun::EssDescribeScheduledTasksScheduledTaskType>_>
  ::~vector((vector<aliyun::EssDescribeScheduledTasksScheduledTaskType,_std::allocator<aliyun::EssDescribeScheduledTasksScheduledTaskType>_>
             *)&resp);
  aliyun::EssDescribeScheduledTasksRequestType::~EssDescribeScheduledTasksRequestType
            ((EssDescribeScheduledTasksRequestType *)&req);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main() {
  test_attach_instances();
  test_create_scaling_configuration();
  test_create_scaling_group();
  test_create_scaling_rule();
  test_create_scheduled_task();
  test_delete_scaling_configuration();
  test_delete_scaling_group();
  test_delete_scaling_rule();
  test_delete_scheduled_task();
  test_describe_scaling_activities();
  test_describe_scaling_configurations();
  test_describe_scaling_groups();
  test_describe_scaling_instances();
  test_describe_scaling_rules();
  test_describe_scheduled_tasks();
  test_detach_instances();
  test_disable_scaling_group();
  test_enable_scaling_group();
  test_execute_scaling_rule();
  test_modify_scaling_group();
  test_modify_scaling_rule();
  test_modify_scheduled_task();
  test_remove_instances();
}